

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall
Spaghetti<TTA>::PerformLabelingMem
          (Spaghetti<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer piVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 *puVar14;
  long lVar15;
  long lVar16;
  undefined4 uVar17;
  int *piVar18;
  long *plVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long *plVar25;
  Spaghetti<TTA> *pSVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long *plVar34;
  long lVar35;
  long lVar36;
  long *plVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  double dVar42;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_338 [104];
  Mat local_2d0 [16];
  ulong local_2c0;
  long *local_288;
  long *local_270;
  long *local_268;
  undefined1 local_260 [104];
  Mat local_1f8 [16];
  long local_1e8;
  long *local_1b0;
  pointer local_198;
  ulong local_190;
  Spaghetti<TTA> *local_188;
  long *local_180;
  long local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  long *local_140;
  long *local_138;
  long local_130;
  long *local_128;
  long local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0x8;
  uVar22 = (ulong)iVar3;
  iVar4 = *(int *)&pMVar5->field_0xc;
  lVar28 = (long)iVar4;
  TTA::MemAlloc(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) * ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1)
                + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_260,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar27 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar27 << 0x20 | uVar27 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_338,&local_110,0);
  local_198 = (pointer)(lVar28 + -2);
  local_188 = this;
  local_118 = accesses;
  if (iVar3 == 1) {
    if (2 < iVar4) {
      iVar13 = (int)local_198;
      lVar39 = (long)(int)local_198;
      iVar9 = -2;
      iVar11 = 0;
LAB_0016d1d1:
      lVar36 = (long)iVar11;
      piVar18 = (int *)(local_1e8 + lVar36 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(local_260._24_8_ + lVar36) == '\0') goto LAB_0016d21e;
      piVar18 = (int *)(local_1e8 + 0xc + (long)iVar9 * 4);
      *piVar18 = *piVar18 + 1;
      cVar1 = *(char *)(local_260._24_8_ + 3 + (long)iVar9);
      uVar10 = TTA::MemNewLabel();
      if (cVar1 != '\0') {
        do {
          piVar18 = (int *)(lVar36 * 4 + local_2c0);
          *piVar18 = *piVar18 + 1;
          *(uint *)(local_338._24_8_ + lVar36 * 4) = uVar10;
          iVar9 = iVar11 + 2;
          iVar21 = iVar11;
          if (iVar13 <= iVar11 + 2) {
LAB_0016d81f:
            iVar11 = iVar9;
            lVar39 = (long)iVar11;
            piVar18 = (int *)(local_1e8 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            pSVar26 = local_188;
            if ((int)local_198 < iVar11) {
              if (*(char *)(local_260._24_8_ + lVar39) == '\0') {
                piVar18 = (int *)(local_2c0 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = 0;
              }
              else {
                piVar18 = (int *)(local_2c0 + (long)iVar21 * 4);
                *piVar18 = *piVar18 + 1;
                uVar17 = *(undefined4 *)(local_338._24_8_ + (long)iVar21 * 4);
                piVar18 = (int *)(local_2c0 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = uVar17;
              }
            }
            else {
              if (*(char *)(local_260._24_8_ + lVar39) == '\0') goto LAB_0016da1e;
              lVar36 = (long)iVar21;
              piVar18 = (int *)(local_1e8 + 0xc + lVar36 * 4);
              *piVar18 = *piVar18 + 1;
              piVar18 = (int *)(local_2c0 + lVar36 * 4);
              *piVar18 = *piVar18 + 1;
              uVar17 = *(undefined4 *)(local_338._24_8_ + lVar36 * 4);
              piVar18 = (int *)(local_2c0 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = uVar17;
            }
            goto LAB_0017a54f;
          }
          lVar31 = (long)iVar11;
          lVar41 = lVar31 << 0x20;
          lVar36 = local_1e8 + lVar31 * 4;
          lVar16 = local_2c0 + lVar31 * 4;
          lVar33 = local_338._24_8_ + lVar31 * 4;
          lVar35 = 0;
          while( true ) {
            piVar18 = (int *)(lVar36 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            iVar9 = (int)(lVar31 + 2);
            if (*(char *)(local_260._24_8_ + lVar31 + 2 + lVar35) == '\0') break;
            piVar18 = (int *)(lVar36 + 0xc + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(local_260._24_8_ + lVar31 + 3 + lVar35) == '\0') {
              piVar18 = (int *)(local_2c0 + (lVar41 >> 0x1e));
              *piVar18 = *piVar18 + 1;
              uVar17 = *(undefined4 *)(local_338._24_8_ + (lVar41 >> 0x1e));
              piVar18 = (int *)(local_2c0 + lVar31 * 4 + 8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(local_338._24_8_ + lVar31 * 4 + 8 + lVar35 * 4) = uVar17;
              iVar9 = iVar9 + (int)lVar35;
              goto LAB_0016d365;
            }
            piVar18 = (int *)(lVar16 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)(lVar33 + lVar35 * 4);
            piVar18 = (int *)(lVar16 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(lVar33 + 8 + lVar35 * 4) = uVar17;
            lVar41 = lVar41 + 0x200000000;
            lVar24 = lVar31 + 2 + lVar35;
            lVar35 = lVar35 + 2;
            if (lVar39 <= lVar24 + 2) {
              iVar9 = iVar11 + (int)lVar35 + 2;
              iVar21 = iVar11 + (int)lVar35;
              goto LAB_0016d81f;
            }
          }
          iVar11 = iVar9 + (int)lVar35;
LAB_0016d21e:
          lVar36 = (long)iVar11;
          piVar18 = (int *)(local_1e8 + 4 + lVar36 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(local_260._24_8_ + 1 + lVar36) == '\0') goto LAB_0016d306;
          uVar10 = TTA::MemNewLabel();
        } while( true );
      }
      piVar18 = (int *)(local_2c0 + lVar36 * 4);
      *piVar18 = *piVar18 + 1;
      *(uint *)(local_338._24_8_ + lVar36 * 4) = uVar10;
      iVar9 = iVar11;
      goto LAB_0016d365;
    }
    iVar11 = 0;
    lVar39 = 1;
    goto LAB_0016d7c1;
  }
  uVar10 = 0;
  if (2 < iVar4) {
    uVar27 = 0;
    do {
      lVar39 = (long)(int)uVar27;
      piVar18 = (int *)(local_1e8 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(local_260._24_8_ + lVar39) != '\0') goto LAB_0016d6d9;
      piVar18 = (int *)(local_1e8 + *local_1b0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar39 + local_260._24_8_ + *(long *)local_260._80_8_) != '\0')
      goto LAB_0016d6d9;
LAB_0016d3d1:
      lVar39 = (long)(int)uVar27;
      piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      if ((*(char *)(local_260._24_8_ + 1 + lVar39) != '\0') ||
         (piVar18 = (int *)(local_1e8 + *local_1b0 + 4 + lVar39 * 4), *piVar18 = *piVar18 + 1,
         *(char *)(lVar39 + 1 + local_260._24_8_ + *(long *)local_260._80_8_) != '\0')) {
        uVar10 = TTA::MemNewLabel();
LAB_0016d44e:
        piVar18 = (int *)(local_2c0 + lVar39 * 4);
        *piVar18 = *piVar18 + 1;
        *(uint *)(local_338._24_8_ + lVar39 * 4) = uVar10;
LAB_0016d463:
        lVar39 = (long)(int)uVar27;
        uVar10 = (int)uVar27 + 2;
        uVar27 = (ulong)uVar10;
        if ((int)uVar10 < (int)local_198) {
          piVar18 = (int *)(local_1e8 + 8 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          if ((*(char *)(local_260._24_8_ + 2 + lVar39) != '\0') ||
             (piVar18 = (int *)(local_1e8 + *local_1b0 + 8 + lVar39 * 4), *piVar18 = *piVar18 + 1,
             *(char *)(lVar39 + 2 + local_260._24_8_ + *(long *)local_260._80_8_) != '\0')) {
LAB_0016d4bb:
            lVar39 = (long)(int)uVar27;
            piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            lVar36 = (long)((int)uVar27 + -2);
            if (*(char *)(local_260._24_8_ + 1 + lVar39) == '\0') {
              piVar18 = (int *)(local_2c0 + lVar36 * 4);
              *piVar18 = *piVar18 + 1;
              uVar17 = *(undefined4 *)(local_338._24_8_ + lVar36 * 4);
              piVar18 = (int *)(local_2c0 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = uVar17;
              do {
                iVar11 = (int)uVar27;
                uVar10 = iVar11 + 2;
                if ((int)local_198 <= (int)uVar10) {
LAB_0016d884:
                  lVar39 = (long)(int)uVar10;
                  piVar18 = (int *)(local_1e8 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  if ((int)local_198 < (int)uVar10) {
                    if ((*(char *)(local_260._24_8_ + lVar39) == '\0') &&
                       (piVar18 = (int *)(local_1e8 + *local_1b0 + lVar39 * 4),
                       *piVar18 = *piVar18 + 1,
                       *(char *)(lVar39 + local_260._24_8_ + *(long *)local_260._80_8_) == '\0')) {
                      piVar18 = (int *)(local_2c0 + lVar39 * 4);
                      *piVar18 = *piVar18 + 1;
                      *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = 0;
                      goto LAB_0016dc51;
                    }
                  }
                  else {
                    if (*(char *)(local_260._24_8_ + lVar39) != '\0') {
                      piVar18 = (int *)(local_1e8 + *local_1b0 + 4 + (long)iVar11 * 4);
                      *piVar18 = *piVar18 + 1;
                      if (*(char *)((long)iVar11 + 1 + local_260._24_8_ + *(long *)local_260._80_8_)
                          != '\0') goto LAB_0016d9be;
                      goto LAB_0016d9ed;
                    }
                    piVar18 = (int *)(*local_1b0 + local_1e8 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar39 + local_260._24_8_ + *(long *)local_260._80_8_) == '\0')
                    goto LAB_0016dbde;
                    piVar18 = (int *)(local_1e8 + 0xc + (long)iVar11 * 4);
                    *piVar18 = *piVar18 + 1;
                  }
                  lVar36 = (long)iVar11;
                  piVar18 = (int *)(local_1e8 + *local_1b0 + 4 + lVar36 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar36 + 1 + local_260._24_8_ + *(long *)local_260._80_8_) == '\0')
                  {
                    uVar10 = TTA::MemNewLabel();
                    piVar18 = (int *)(local_2c0 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    *(uint *)(local_338._24_8_ + lVar39 * 4) = uVar10;
                  }
                  else {
                    piVar18 = (int *)(local_2c0 + lVar36 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar17 = *(undefined4 *)(local_338._24_8_ + lVar36 * 4);
                    piVar18 = (int *)(local_2c0 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = uVar17;
                  }
                  goto LAB_0016dc51;
                }
                lVar33 = (long)iVar11;
                lVar39 = lVar33 + 2;
                lVar16 = lVar33 << 0x20;
                lVar36 = lVar33 * 4;
                lVar35 = 0;
                while( true ) {
                  piVar18 = (int *)(local_1e8 + lVar36 + 8 + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar35 + local_260._24_8_ + lVar39) != '\0') break;
                  lVar24 = *local_1b0;
                  lVar31 = local_1e8 + lVar24 + lVar36;
                  piVar18 = (int *)(lVar31 + 8 + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar32 = *(long *)local_260._80_8_;
                  lVar41 = local_260._24_8_ + lVar32 + lVar39;
                  if (*(char *)(lVar35 + lVar41) == '\0') {
                    uVar27 = (ulong)(uint)((int)lVar39 + (int)lVar35);
                    goto LAB_0016d3d1;
                  }
                  piVar18 = (int *)(local_1e8 + lVar36 + 0xc + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar35 + 1 + local_260._24_8_ + lVar39) != '\0') {
                    piVar18 = (int *)(local_1e8 + lVar24 + (lVar16 + 0x100000000 >> 0x1e));
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(local_260._24_8_ + lVar32 + (lVar16 + 0x100000000 >> 0x20)) ==
                        '\0') {
                      uVar10 = TTA::MemNewLabel();
                      piVar18 = (int *)(local_2c0 + lVar36 + 8 + lVar35 * 4);
                      *piVar18 = *piVar18 + 1;
                      *(uint *)(lVar36 + local_338._24_8_ + 8 + lVar35 * 4) = uVar10;
                    }
                    else {
                      piVar18 = (int *)(local_2c0 + (lVar16 >> 0x1e));
                      *piVar18 = *piVar18 + 1;
                      uVar17 = *(undefined4 *)(local_338._24_8_ + (lVar16 >> 0x1e));
                      piVar18 = (int *)(local_2c0 + lVar33 * 4 + 8 + lVar35 * 4);
                      *piVar18 = *piVar18 + 1;
                      *(undefined4 *)(local_338._24_8_ + lVar33 * 4 + 8 + lVar35 * 4) = uVar17;
                    }
                    uVar27 = lVar39 + lVar35 & 0xffffffff;
                    goto LAB_0016d463;
                  }
                  piVar18 = (int *)(lVar31 + 4 + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar35 + -1 + lVar41) == '\0') {
                    uVar10 = TTA::MemNewLabel();
                    piVar18 = (int *)(local_2c0 + lVar36 + 8 + lVar35 * 4);
                    *piVar18 = *piVar18 + 1;
                  }
                  else {
                    piVar18 = (int *)(local_2c0 + lVar36 + lVar35 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = *(uint *)(local_338._24_8_ + lVar36 + lVar35 * 4);
                    piVar18 = (int *)(local_2c0 + lVar36 + 8 + lVar35 * 4);
                    *piVar18 = *piVar18 + 1;
                  }
                  *(uint *)(local_338._24_8_ + lVar36 + 8 + lVar35 * 4) = uVar10;
                  lVar16 = lVar16 + 0x200000000;
                  lVar31 = lVar39 + lVar35;
                  lVar35 = lVar35 + 2;
                  if ((long)local_198 <= lVar31 + 2) {
                    uVar10 = iVar11 + (int)lVar35 + 2;
                    iVar11 = iVar11 + (int)lVar35;
                    goto LAB_0016d884;
                  }
                }
                piVar18 = (int *)((lVar16 + 0x100000000 >> 0x1e) + local_1e8 + *local_1b0);
                *piVar18 = *piVar18 + 1;
                if (*(char *)((lVar16 + 0x100000000 >> 0x20) +
                             local_260._24_8_ + *(long *)local_260._80_8_) != '\0')
                goto code_r0x0016d651;
                uVar27 = lVar39 + lVar35 & 0xffffffff;
LAB_0016d6d9:
                lVar39 = (long)(int)uVar27;
                piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                cVar1 = *(char *)(local_260._24_8_ + 1 + lVar39);
                uVar10 = TTA::MemNewLabel();
                if (cVar1 != '\0') goto LAB_0016d44e;
                piVar18 = (int *)(local_2c0 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(uint *)(local_338._24_8_ + lVar39 * 4) = uVar10;
              } while( true );
            }
            piVar18 = (int *)(local_2c0 + lVar36 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)(local_338._24_8_ + lVar36 * 4);
            piVar18 = (int *)(local_2c0 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = uVar17;
            goto LAB_0016d463;
          }
          goto LAB_0016d3d1;
        }
        piVar18 = (int *)(local_1e8 + 8 + lVar39 * 4);
        *piVar18 = *piVar18 + 1;
        cVar1 = *(char *)(local_260._24_8_ + 2 + lVar39);
        if ((int)local_198 < (int)uVar10) {
          if (cVar1 == '\0') {
            piVar18 = (int *)(local_1e8 + *local_1b0 + 8 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar39 + 2 + local_260._24_8_ + *(long *)local_260._80_8_) == '\0') {
              piVar18 = (int *)(local_2c0 + 8 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(local_338._24_8_ + 8 + lVar39 * 4) = 0;
            }
            else {
              piVar18 = (int *)(local_2c0 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              uVar17 = *(undefined4 *)(local_338._24_8_ + lVar39 * 4);
              piVar18 = (int *)(local_2c0 + 8 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(local_338._24_8_ + 8 + lVar39 * 4) = uVar17;
            }
          }
          else {
            piVar18 = (int *)(local_2c0 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)(local_338._24_8_ + lVar39 * 4);
            piVar18 = (int *)(local_2c0 + 8 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(local_338._24_8_ + 8 + lVar39 * 4) = uVar17;
          }
        }
        else {
          if ((cVar1 == '\0') &&
             (piVar18 = (int *)(local_1e8 + *local_1b0 + 8 + lVar39 * 4), *piVar18 = *piVar18 + 1,
             *(char *)(lVar39 + 2 + local_260._24_8_ + *(long *)local_260._80_8_) == '\0'))
          goto LAB_0016dbde;
LAB_0016d9be:
          lVar39 = (long)(int)uVar10;
          piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          piVar18 = (int *)((local_2c0 - 8) + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          uVar17 = *(undefined4 *)(local_338._24_8_ + -8 + lVar39 * 4);
          piVar18 = (int *)(local_2c0 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = uVar17;
        }
        goto LAB_0016dc51;
      }
      piVar18 = (int *)(local_2c0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = 0;
      uVar10 = (int)uVar27 + 2;
      uVar27 = (ulong)uVar10;
    } while ((int)uVar10 < (int)local_198);
  }
  lVar39 = (long)(int)uVar10;
  piVar18 = (int *)(local_1e8 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  if ((int)local_198 < (int)uVar10) {
    if (*(char *)(local_260._24_8_ + lVar39) == '\0') {
      piVar18 = (int *)(local_1e8 + *local_1b0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      cVar1 = *(char *)(lVar39 + local_260._24_8_ + *(long *)local_260._80_8_);
joined_r0x0016dc2f:
      if (cVar1 == '\0') {
        piVar18 = (int *)(local_2c0 + lVar39 * 4);
        *piVar18 = *piVar18 + 1;
        *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = 0;
        goto LAB_0016dc51;
      }
    }
  }
  else if ((*(char *)(local_260._24_8_ + lVar39) == '\0') &&
          (piVar18 = (int *)(local_1e8 + *local_1b0 + lVar39 * 4), *piVar18 = *piVar18 + 1,
          *(char *)(lVar39 + local_260._24_8_ + *(long *)local_260._80_8_) == '\0')) {
LAB_0016dbde:
    lVar39 = (long)(int)uVar10;
    piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(local_260._24_8_ + 1 + lVar39) == '\0') {
      piVar18 = (int *)(local_1e8 + *local_1b0 + 4 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      cVar1 = *(char *)(lVar39 + 1 + local_260._24_8_ + *(long *)local_260._80_8_);
      goto joined_r0x0016dc2f;
    }
  }
  else {
LAB_0016d9ed:
    lVar39 = (long)(int)uVar10;
    piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
  }
  uVar10 = TTA::MemNewLabel();
  piVar18 = (int *)(local_2c0 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  *(uint *)(local_338._24_8_ + lVar39 * 4) = uVar10;
LAB_0016dc51:
  iVar11 = iVar3 - (((uint)(uVar22 >> 0x1f) & 1) + iVar3 & 0xfffffffe);
  local_150 = (long *)CONCAT44(local_150._4_4_,iVar11);
  uVar10 = iVar3 - iVar11;
  if (2 < (int)uVar10) {
    local_178 = (long)(int)local_198;
    plVar19 = (long *)(ulong)uVar10;
    plVar34 = (long *)0x2;
    plVar25 = (long *)0x1;
    lVar36 = 3;
    lVar39 = 0;
    local_268 = plVar19;
    do {
      if (2 < iVar4) {
        piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34);
        *piVar18 = *piVar18 + 1;
        uVar27 = 0;
        local_270 = plVar25;
        if (*(char *)(local_260._24_8_ + *(long *)local_260._80_8_ * (long)plVar34) == '\0')
        goto LAB_0016e045;
LAB_0016ddea:
        lVar16 = (long)plVar34 + -1;
        uVar20 = (ulong)(int)uVar27;
        piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + uVar20 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0') {
          piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
              != '\0') goto LAB_0016e13b;
          uVar38 = (ulong)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar38 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
          goto LAB_0016df8f;
          uVar10 = TTA::MemNewLabel();
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          lVar16 = *(long *)local_338._80_8_;
          goto LAB_0016f0bc;
        }
LAB_00174ec0:
        piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar20 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                          uVar20 * 4);
        uVar38 = uVar27;
LAB_00174ef0:
        do {
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + uVar20 * 4) =
               uVar10;
          iVar11 = (int)uVar38;
          uVar10 = iVar11 + 2;
          if ((int)local_198 <= (int)uVar10) {
LAB_00175149:
            uVar27 = (ulong)uVar10;
            lVar33 = (long)(int)uVar10;
            piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            cVar1 = *(char *)(lVar33 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
            ;
            lVar16 = *local_1b0;
            if ((int)local_198 < (int)uVar10) {
              if (cVar1 == '\0') {
                piVar18 = (int *)(local_1e8 + lVar16 * ((ulong)plVar34 | 1) + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar33 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ +
                                       local_260._24_8_) == '\0') {
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(undefined4 *)
                   (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) = 0;
                  goto LAB_00175894;
                }
LAB_001756d8:
                lVar16 = (long)iVar11;
                piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
                *piVar18 = *piVar18 + 1;
                if ((*(char *)(lVar16 + 1 +
                              ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
                     != '\0') ||
                   (piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + lVar16 * 4),
                   *piVar18 = *piVar18 + 1,
                   *(char *)(lVar16 + 1 +
                            *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0'))
                {
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar35 = *(long *)local_338._80_8_ * (long)plVar34;
                  lVar16 = *local_288;
LAB_0017578d:
                  uVar10 = *(uint *)(lVar35 + local_338._24_8_ + (long)iVar11 * 4);
                  goto LAB_0017579c;
                }
                uVar10 = TTA::MemNewLabel();
                lVar16 = *local_288 * (long)plVar34 + local_2c0;
LAB_00176246:
                piVar18 = (int *)(lVar16 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
              }
              else {
                lVar35 = (long)iVar11;
                piVar18 = (int *)(local_1e8 + lVar16 * (long)plVar34 + 4 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                if ((*(char *)(lVar35 + 1 +
                              *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
                   && (piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 +
                                        lVar35 * 4), *piVar18 = *piVar18 + 1,
                      *(char *)(lVar35 + 1 +
                               ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
                      == '\0')) {
LAB_00175d02:
                  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar35 = (long)plVar34 + -2;
                  if (*(char *)(lVar33 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ +
                                         local_260._24_8_) == '\0') {
                    piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + (long)iVar11 * 4);
                    *piVar18 = *piVar18 + 1;
                    lVar35 = lVar35 * *(long *)local_338._80_8_;
                    lVar16 = *local_288;
                    goto LAB_0017578d;
                  }
                  piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar17 = *(undefined4 *)
                            (lVar35 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(undefined4 *)
                   (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
                       uVar17;
                  goto LAB_00175894;
                }
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                lVar16 = *local_288;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ +
                                  lVar35 * 4);
LAB_0017579c:
                piVar18 = (int *)(lVar16 * (long)plVar34 + local_2c0 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
              }
              *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
                   uVar10;
              goto LAB_00175894;
            }
            if (cVar1 == '\0') {
              uVar20 = (ulong)plVar34 | 1;
              piVar18 = (int *)(local_1e8 + lVar16 * uVar20 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar33 + *(long *)local_260._80_8_ * uVar20 + local_260._24_8_) == '\0')
              goto LAB_001757c7;
              lVar16 = (long)iVar11;
              piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar16 + 3 +
                           *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
              goto LAB_001756d8;
              piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar16 + 1 +
                           *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0')
              goto LAB_001754fb;
              piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 4 + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar16 + 1 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                  '\0') goto LAB_0016dcfe;
              lVar35 = (long)plVar34 + -1;
              piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + 0xc + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar35 + local_260._24_8_) ==
                  '\0') {
                piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar33 + lVar35 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar17 = *(undefined4 *)
                            (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ +
                            lVar16 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                }
                else {
                  piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar17 = *(undefined4 *)
                            (((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                            lVar33 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                }
                *(undefined4 *)
                 (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
                     uVar17;
                goto LAB_00175894;
              }
LAB_0017553c:
              lVar33 = (long)(int)uVar10;
              piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar33 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ +
                                     local_260._24_8_) == '\0') {
                piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
                plVar37 = plVar19;
                if (*(char *)(lVar33 + *(long *)local_260._80_8_ * ((long)plVar34 + -2) +
                                       local_260._24_8_) != '\0') {
LAB_0017568e:
                  piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar16 = *local_288 * (long)plVar34 + local_2c0;
                  uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                     local_338._24_8_ + lVar33 * 4);
                  goto LAB_00175875;
                }
LAB_001701dd:
                piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
                lVar16 = *local_288 * (long)plVar34 + local_2c0;
                uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                   local_338._24_8_ + lVar33 * 4);
LAB_00170222:
                piVar18 = (int *)(lVar16 + -8 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                        local_338._24_8_ + -8 + lVar33 * 4));
                plVar37 = plVar19;
                goto LAB_0017584f;
              }
LAB_0017557f:
              piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              lVar16 = *local_288 * (long)plVar34 + local_2c0;
              uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_
                                + lVar33 * 4);
            }
            else {
              lVar35 = (long)iVar11;
              piVar18 = (int *)(local_1e8 + lVar16 * (long)plVar34 + 4 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if ((*(char *)(lVar35 + 1 +
                            *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0')
                 || (piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 +
                                      lVar35 * 4), *piVar18 = *piVar18 + 1,
                    *(char *)(lVar35 + 1 +
                             ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
                    '\0')) {
LAB_001754fb:
                lVar16 = (long)(int)uVar10;
                piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + lVar16 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar16 + 1 +
                             ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
                    '\0') goto LAB_0017553c;
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar16 * 4);
                *piVar18 = *piVar18 + 1;
                uVar17 = *(undefined4 *)
                          (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                          lVar16 * 4);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)
                 (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4) =
                     uVar17;
                goto LAB_00175894;
              }
              lVar16 = (long)plVar34 + -1;
              piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 0xc + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) ==
                  '\0') goto LAB_00175d02;
              piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              plVar37 = plVar19;
              if (*(char *)(lVar33 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
              {
                piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
                *piVar18 = *piVar18 + 1;
                lVar16 = *local_288 * (long)plVar34 + local_2c0;
                uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                   local_338._24_8_ + lVar33 * 4);
                goto LAB_00176246;
              }
LAB_00175e98:
              lVar16 = (long)plVar34 + -2;
              lVar33 = (long)(int)uVar10;
              piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              plVar19 = plVar37;
              if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
              goto LAB_0017557f;
              piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + -8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + -8 +
                                lVar33 * 4);
              piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4)
              ;
LAB_0017423f:
              uVar10 = TTA::MemMerge(uVar10,uVar12);
              lVar16 = *local_288 * (long)plVar34 + local_2c0;
              plVar19 = plVar37;
            }
            piVar18 = (int *)(lVar16 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
                 uVar10;
            goto LAB_00175894;
          }
          local_160 = (long)plVar34 + -1;
          local_190 = (ulong)iVar11;
          local_180 = (long *)(local_190 + 2);
          lVar31 = local_190 << 0x20;
          lVar16 = local_1e8 + local_190 * 4;
          lVar33 = *local_1b0;
          lVar35 = *(long *)local_260._80_8_;
          lVar24 = local_260._24_8_ + local_190;
          lVar29 = local_338._24_8_ + local_190 * 4 + 8;
          lVar32 = local_2c0 + local_190 * 4 + 8;
          lVar41 = 0;
          while( true ) {
            piVar18 = (int *)(lVar33 * (long)plVar34 + local_190 * 4 + local_1e8 + 8 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            lVar30 = lVar31 >> 0x1e;
            plVar19 = local_268;
            plVar25 = local_270;
            local_168 = uVar38;
            plVar37 = local_268;
            if (*(char *)(local_260._24_8_ + lVar35 * (long)plVar34 + local_190 + 2 + lVar41) ==
                '\0') goto LAB_001758e9;
            piVar18 = (int *)(*local_1b0 * (long)plVar34 + lVar16 + 4 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            iVar13 = (int)local_180;
            if ((*(char *)(lVar41 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + lVar24) != '\0')
               || (piVar18 = (int *)(*local_1b0 * lVar36 + lVar16 + 4 + lVar41 * 4),
                  *piVar18 = *piVar18 + 1,
                  *(char *)(lVar41 + 1 + *(long *)local_260._80_8_ * lVar36 + lVar24) != '\0')) {
              uVar27 = (ulong)(uint)(iVar13 + (int)lVar41);
              goto LAB_001738cd;
            }
            piVar18 = (int *)(*local_1b0 * (long)local_270 + lVar16 + 0xc + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 3 + *(long *)local_260._80_8_ * (long)local_270 + lVar24) == '\0'
               ) {
              uVar27 = (long)local_180 + lVar41;
              piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + local_190 * 4 + 0xc +
                               lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              uVar38 = local_190 + 2 + lVar41;
              if (*(char *)(local_190 + lVar41 + 3 +
                           *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0') {
                piVar18 = (int *)(local_1e8 + *local_1b0 * (long)local_270 + local_190 * 4 + 8 +
                                 lVar41 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar41 + 2 +
                             *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_ +
                             local_190) != '\0') {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4
                                   );
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     local_190 * 4 + 8 + lVar41 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 +
                                   lVar41 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar16 = *(long *)local_338._80_8_;
                  goto LAB_00170820;
                }
                piVar18 = (int *)(lVar30 + *local_288 * ((long)plVar34 + -2) + local_2c0);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(lVar30 + ((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                            local_338._24_8_);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 +
                                 lVar41 * 4);
                *piVar18 = *piVar18 + 1;
                lVar16 = *(long *)local_338._80_8_;
                goto LAB_0016f0bc;
              }
              piVar18 = (int *)(local_1e8 + *local_1b0 * local_160 + (lVar31 + 0x400000000 >> 0x1e))
              ;
              *piVar18 = *piVar18 + 1;
              cVar1 = *(char *)((lVar31 + 0x400000000 >> 0x20) +
                               local_160 * *(long *)local_260._80_8_ + local_260._24_8_);
              piVar18 = (int *)(*local_1b0 * (long)local_270 + local_1e8 + local_190 * 4 + 8 +
                               lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              cVar2 = *(char *)(lVar41 + 2 +
                               *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_ +
                               local_190);
              if (cVar1 != '\0') {
                if (cVar2 == '\0') goto LAB_00176294;
                goto LAB_0016e1bd;
              }
              if (cVar2 == '\0') {
                piVar18 = (int *)(lVar30 + *local_288 * ((long)plVar34 + -2) + local_2c0);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(lVar30 + ((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                            local_338._24_8_);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 +
                                 lVar41 * 4);
                *piVar18 = *piVar18 + 1;
                lVar16 = *(long *)local_338._80_8_;
                goto LAB_001713a6;
              }
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                 local_190 * 4 + 8 + lVar41 * 4);
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 +
                               lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              lVar16 = *(long *)local_338._80_8_;
              goto LAB_0016e2da;
            }
            piVar18 = (int *)(*local_1b0 * (long)local_270 + lVar16 + 8 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 2 + *(long *)local_260._80_8_ * (long)local_270 + lVar24) == '\0'
               ) break;
            piVar18 = (int *)(*local_288 * lVar39 + lVar32 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)(*(long *)local_338._80_8_ * lVar39 + lVar29 + lVar41 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + lVar32 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + lVar29 + lVar41 * 4) =
                 uVar17;
            lVar31 = lVar31 + 0x200000000;
            lVar30 = local_190 + lVar41;
            lVar41 = lVar41 + 2;
            if (local_178 <= lVar30 + 4) {
              iVar11 = iVar11 + (int)lVar41;
              uVar10 = iVar13 + (int)lVar41;
              goto LAB_00175149;
            }
          }
          uVar27 = (ulong)(uint)(iVar13 + (int)lVar41);
LAB_00175c3d:
          plVar19 = local_268;
          lVar16 = (long)plVar34 + -2;
          uVar20 = (ulong)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
          goto LAB_00174ec0;
          piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + -8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + -8 + uVar20 * 4
                            );
          piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar16 * *(long *)local_338._80_8_ +
                                                  local_338._24_8_ + uVar20 * 4));
          uVar38 = uVar27;
        } while( true );
      }
      if (iVar4 == 2) {
        piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34);
        *piVar18 = *piVar18 + 1;
        uVar27 = 0;
        if (*(char *)(local_260._24_8_ + *(long *)local_260._80_8_ * (long)plVar34) == '\0') {
LAB_0016ead9:
          lVar16 = *local_1b0;
          lVar33 = (long)(int)uVar27;
          piVar18 = (int *)(lVar16 * ((ulong)plVar34 | 1) + local_1e8 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          lVar35 = *(long *)local_260._80_8_;
          if (*(char *)(lVar33 + ((ulong)plVar34 | 1) * lVar35 + local_260._24_8_) == '\0') {
LAB_001757c7:
            uVar10 = (uint)uVar27;
            piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + (long)(int)uVar10 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)((long)(int)uVar10 + 1 +
                         *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0')
            goto LAB_0016dcfe;
LAB_0017580a:
            lVar33 = (long)(int)uVar10;
            piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + 1 +
                         ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                '\0') goto LAB_001758b2;
          }
          else {
            piVar18 = (int *)(local_1e8 + lVar16 * (long)plVar34 + 4 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + 1 + local_260._24_8_ + lVar35 * (long)plVar34) != '\0')
            goto LAB_0016dcfe;
          }
LAB_0017584a:
          uVar10 = TTA::MemNewLabel();
          plVar37 = plVar19;
LAB_0017584f:
          lVar16 = *local_288 * (long)plVar34 + local_2c0;
LAB_00175875:
          piVar18 = (int *)(lVar16 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
LAB_00175878:
          *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
               uVar10;
          plVar19 = plVar37;
        }
        else {
LAB_0016dcfe:
          lVar16 = (long)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar16 + 1 +
                       ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
          goto LAB_0016de7d;
          lVar33 = *local_288;
          piVar18 = (int *)(lVar33 * ((long)plVar34 + -2) + local_2c0 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          lVar35 = *(long *)local_338._80_8_;
          uVar17 = *(undefined4 *)(((long)plVar34 + -2) * lVar35 + local_338._24_8_ + lVar16 * 4);
          piVar18 = (int *)(lVar33 * (long)plVar34 + local_2c0 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(lVar35 * (long)plVar34 + local_338._24_8_ + lVar16 * 4) = uVar17;
        }
      }
      else {
        piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34);
        *piVar18 = *piVar18 + 1;
        uVar10 = 0;
        uVar27 = 0;
        if (*(char *)(local_260._24_8_ + *(long *)local_260._80_8_ * (long)plVar34) == '\0') {
LAB_0016ea06:
          lVar33 = (long)(int)uVar10;
          piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar33 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                       ) != '\0') goto LAB_0017584a;
LAB_001758b2:
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4)
               = 0;
        }
        else {
LAB_0016de7d:
          lVar33 = (long)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar33 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                       ) == '\0') goto LAB_0017584a;
          lVar16 = *local_288;
          piVar18 = (int *)(lVar16 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          lVar35 = *(long *)local_338._80_8_;
          uVar17 = *(undefined4 *)(((long)plVar34 + -2) * lVar35 + local_338._24_8_ + lVar33 * 4);
          piVar18 = (int *)(lVar16 * (long)plVar34 + local_2c0 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(lVar35 * (long)plVar34 + local_338._24_8_ + lVar33 * 4) = uVar17;
        }
      }
LAB_00175894:
      plVar34 = (long *)((long)plVar34 + 2);
      plVar25 = (long *)((long)plVar25 + 2);
      lVar39 = lVar39 + 2;
      lVar36 = lVar36 + 2;
    } while (plVar34 < plVar19);
  }
  pSVar26 = local_188;
  if ((int)local_150 == 1) {
    local_160 = CONCAT44(local_160._4_4_,iVar3 + -1);
    uVar10 = 0;
    if (2 < iVar4) {
      lVar33 = (long)(iVar3 + -1);
      plVar25 = (long *)(uVar22 - 2);
      local_150 = (long *)(uVar22 - 3);
      local_268 = (long *)(uVar22 - 3);
      lVar39 = uVar22 - 3;
      local_140 = (long *)(long)(iVar3 + -3);
      lVar36 = (long)(iVar3 + -2);
      local_128 = (long *)(long)(iVar3 + -3);
      local_138 = (long *)(long)(iVar3 + -3);
      local_158 = (long *)(long)(iVar3 + -3);
      local_130 = (long)(iVar3 + -3);
      local_148 = (long)(iVar3 + -3);
      lVar16 = (long)(int)local_198;
      local_120 = (long)(iVar3 + -3);
      iVar11 = -2;
      uVar27 = 0;
      local_270 = plVar25;
      local_178 = lVar36;
      do {
        uVar20 = (ulong)(int)uVar27;
        piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + uVar20 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
        goto LAB_00176ab7;
        lVar35 = (long)iVar11;
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0xc + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) !=
            '\0') {
          lVar35 = *local_288;
          plVar25 = local_150;
          goto LAB_00178fe3;
        }
        piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
LAB_00176b4c:
          iVar11 = (int)uVar27;
          uVar20 = (ulong)iVar11;
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          cVar1 = *(char *)(uVar20 + 2 +
                           *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_);
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          cVar2 = *(char *)(uVar20 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_);
          if (cVar1 != '\0') {
            if (cVar2 != '\0') goto LAB_00178df2;
            piVar18 = (int *)(*local_288 * (long)local_268 + local_2c0 + 8 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            plVar19 = local_268;
            goto LAB_00178e57;
          }
          if (cVar2 == '\0') {
            uVar10 = TTA::MemNewLabel();
            lVar35 = *local_288 * lVar33 + local_2c0;
            goto LAB_001779f3;
          }
LAB_00176c0b:
          piVar18 = (int *)(*local_288 * local_120 + local_2c0 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          uVar17 = *(undefined4 *)
                    (*(long *)local_338._80_8_ * local_120 + local_338._24_8_ + uVar20 * 4);
          piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) =
               uVar17;
          lVar35 = (long)iVar11;
          uVar20 = lVar35 + 2;
          if ((int)uVar20 < (int)local_198) {
            piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) ==
                '\0') {
              uVar27 = uVar20 & 0xffffffff;
              goto LAB_00177804;
            }
            piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0xc + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                != '\0') {
              piVar18 = (int *)(local_1e8 + *local_1b0 * lVar39 + 8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) !=
                  '\0') {
                uVar27 = uVar20 & 0xffffffff;
LAB_00178273:
                uVar20 = (ulong)(int)uVar27;
                piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + -4 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)((uVar20 - 1) + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_)
                    != '\0') goto LAB_00178f66;
                lVar35 = *local_288 * lVar39 + local_2c0;
                uVar20 = (ulong)(int)uVar27;
                goto LAB_00179027;
              }
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + 8 +
                                lVar35 * 4);
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                      local_338._24_8_ + lVar35 * 4));
LAB_00177171:
              uVar27 = uVar20 & 0xffffffff;
              goto LAB_0017888f;
            }
            piVar18 = (int *)(local_1e8 + *local_1b0 * lVar33 + 0xc + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) !=
                '\0') {
              piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0x10 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar35 + 4 +
                           *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) == '\0') {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                puVar14 = (undefined4 *)
                          (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar35 * 4);
                goto LAB_001777e9;
              }
              piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 0xc + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if ((*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) !=
                   '\0') &&
                 (piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 8 + lVar35 * 4),
                 *piVar18 = *piVar18 + 1, uVar38 = uVar20,
                 *(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) !=
                 '\0')) goto LAB_00178472;
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 0x10 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + 0x10 +
                                lVar35 * 4);
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                      local_338._24_8_ + lVar35 * 4));
              plVar25 = local_270;
LAB_00176fcd:
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
              uVar27 = uVar20 & 0xffffffff;
LAB_00177a19:
              *piVar18 = *piVar18 + 1;
              *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) = uVar10
              ;
              iVar13 = (int)uVar27;
              uVar10 = iVar13 + 2;
              if ((int)uVar10 < (int)local_198) {
                lVar41 = (long)iVar13;
                local_190 = lVar41 + 2;
                lVar24 = lVar41 << 0x20;
                lVar31 = lVar41 * 4;
                lVar32 = 8;
                lVar35 = 0;
LAB_00177a6b:
                piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar31 + 8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                pSVar26 = local_188;
                lVar36 = local_178;
                if (*(char *)(lVar35 + 2 +
                             *(long *)local_260._80_8_ * lVar33 + local_260._24_8_ + lVar41) != '\0'
                   ) {
                  piVar18 = (int *)(local_1e8 + lVar31 + *local_1b0 * (long)plVar25 + 0xc +
                                   lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  iVar9 = (int)lVar35;
                  iVar11 = (int)local_190;
                  if (*(char *)(lVar35 + 3 +
                               *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_ + lVar41
                               ) != '\0') {
                    uVar27 = (ulong)(uint)(iVar11 + iVar9);
                    piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar41 * 4 + 8 + lVar35 * 4)
                    ;
                    *piVar18 = *piVar18 + 1;
                    uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                       lVar41 * 4 + 8 + lVar35 * 4);
                    uVar20 = lVar41 + lVar35 + 2;
                    goto LAB_0017888f;
                  }
                  piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar31 + 0xc + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar36 = lVar24 >> 0x1e;
                  if (*(char *)(lVar35 + 3 +
                               *(long *)local_260._80_8_ * lVar33 + local_260._24_8_ + lVar41) !=
                      '\0') goto code_r0x00177b37;
                  piVar18 = (int *)(lVar36 + *local_288 * lVar33 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  iVar11 = iVar11 + iVar9;
                  uVar10 = *(uint *)(lVar36 + *(long *)local_338._80_8_ * lVar33 + local_338._24_8_)
                  ;
                  lVar35 = lVar41 + lVar35;
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar41 * 4 + lVar32);
LAB_00178359:
                  uVar20 = lVar35 + 2;
                  pSVar26 = local_188;
                  lVar36 = local_178;
                  goto LAB_00179402;
                }
                uVar27 = local_190 + lVar35;
                iVar11 = (int)uVar27;
                piVar18 = (int *)((lVar24 + 0x300000000 >> 0x1e) + local_1e8 + *local_1b0 * lVar33);
                *piVar18 = *piVar18 + 1;
                lVar31 = lVar24 + 0x300000000 >> 0x20;
                uVar20 = lVar41 + 2 + lVar35;
                if (*(char *)(lVar31 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar41 * 4 + lVar32);
                  goto LAB_00177046;
                }
                piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + lVar31 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar31 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                    != '\0') goto code_r0x00177d84;
                piVar18 = (int *)((lVar24 + 0x400000000 >> 0x1e) +
                                 *local_1b0 * (long)plVar25 + local_1e8);
                *piVar18 = *piVar18 + 1;
                if (*(char *)((lVar24 + 0x400000000 >> 0x20) +
                             *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) != '\0')
                {
LAB_00178df2:
                  uVar20 = (ulong)(int)uVar27;
                  piVar18 = (int *)(*local_1b0 * (long)local_158 + local_1e8 + 4 + uVar20 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(uVar20 + 1 +
                               *(long *)local_260._80_8_ * (long)local_158 + local_260._24_8_) ==
                      '\0') {
                    uVar20 = (ulong)(int)uVar27;
                    piVar18 = (int *)(*local_288 * (long)local_158 + local_2c0 + uVar20 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_158 +
                                       local_338._24_8_ + uVar20 * 4);
                    piVar18 = (int *)(*local_288 * (long)local_158 + local_2c0 + 8 + uVar20 * 4);
                    *piVar18 = *piVar18 + 1;
                    lVar36 = *(long *)local_338._80_8_ * (long)local_158;
LAB_00178ecf:
                    uVar12 = *(uint *)(lVar36 + local_338._24_8_ + 8 + uVar20 * 4);
                    goto LAB_00178ed9;
                  }
                  piVar18 = (int *)(*local_288 * (long)local_158 + local_2c0 + 8 + uVar20 * 4);
                  *piVar18 = *piVar18 + 1;
                  plVar19 = local_158;
LAB_00178e57:
                  lVar36 = *(long *)local_338._80_8_ * (long)plVar19;
LAB_001779fc:
                  uVar10 = *(uint *)(lVar36 + local_338._24_8_ + 8 + uVar20 * 4);
                  goto LAB_00177a06;
                }
                goto LAB_00176c0b;
              }
LAB_001795b4:
              uVar20 = (ulong)uVar10;
              if ((int)local_198 < (int)uVar10) goto LAB_001795c7;
              lVar39 = (long)(int)uVar10;
              piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              lVar36 = (long)iVar13;
              if (*(char *)(lVar39 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
              {
                piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar36 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar36 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) ==
                    '\0') goto LAB_00179a9e;
              }
              else {
                piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + 0xc + lVar36 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar36 + 3 +
                             (long)(iVar3 + -2) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                    '\0') {
LAB_00179a11:
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar36 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar17 = *(undefined4 *)
                            (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar36 * 4);
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  goto LAB_0017a125;
                }
              }
LAB_0017a07a:
              lVar36 = (long)(iVar3 + -3);
              lVar16 = *local_288 * lVar36 + local_2c0;
LAB_0017a0f4:
              piVar18 = (int *)(lVar16 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              lVar16 = *local_288 * lVar33 + local_2c0;
              uVar17 = *(undefined4 *)
                        (lVar36 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4);
              goto LAB_0017a122;
            }
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            lVar31 = *(long *)local_338._80_8_ * lVar33;
LAB_00176f30:
            uVar10 = *(uint *)(lVar31 + local_338._24_8_ + lVar35 * 4);
LAB_001772fb:
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
            iVar11 = (int)uVar20;
            goto LAB_00179402;
          }
          if ((int)local_198 < (int)uVar20) {
LAB_001795c7:
            lVar39 = (long)(int)uVar20;
            piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar39 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0') {
LAB_00179a9e:
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) =
                   0;
            }
            else {
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              lVar16 = *local_288 * lVar33 + local_2c0;
              uVar17 = *(undefined4 *)
                        (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 + lVar39 * 4);
LAB_0017a122:
              piVar18 = (int *)(lVar16 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
LAB_0017a125:
              *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) =
                   uVar17;
            }
          }
          else {
            piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) ==
                '\0') {
LAB_00179dfa:
              lVar39 = (long)(int)uVar20;
              piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar39 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) ==
                  '\0') {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4)
                     = 0;
              }
              else {
                piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + 4 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar39 + 1 +
                             (long)(iVar3 + -2) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                    '\0') {
                  uVar10 = TTA::MemNewLabel();
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) =
                       uVar10;
                }
                else {
                  piVar18 = (int *)(*local_288 * (long)(iVar3 + -3) + local_2c0 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar17 = *(undefined4 *)
                            ((long)(iVar3 + -3) * *(long *)local_338._80_8_ + local_338._24_8_ +
                            lVar39 * 4);
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(undefined4 *)
                   (lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) = uVar17;
                }
              }
            }
            else {
              piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + 0xc + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar35 + 3 +
                           (long)(iVar3 + -2) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                  '\0') {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                lVar36 = *(long *)local_338._80_8_ * lVar33 + local_338._24_8_;
                lVar39 = *local_288;
LAB_0017ad2b:
                lVar39 = lVar39 * lVar33 + local_2c0;
                uVar17 = *(undefined4 *)(lVar36 + lVar35 * 4);
LAB_0017ad3b:
                piVar18 = (int *)(lVar39 + 8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)
                 (lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4) = uVar17;
              }
              else {
                lVar39 = (long)(iVar3 + -3);
                piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(lVar39 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                                    lVar35 * 4);
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                          local_338._24_8_ + lVar35 * 4));
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4)
                       = uVar10;
                }
                else {
LAB_0017980e:
                  lVar16 = (long)(iVar3 + -3);
                  lVar39 = (long)(int)uVar20;
                  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  cVar1 = *(char *)(lVar39 + -1 +
                                   *(long *)local_260._80_8_ * lVar16 + local_260._24_8_);
joined_r0x0017a2e0:
                  if (cVar1 == '\0') {
                    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + -8 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + -8 +
                                      lVar39 * 4);
                    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar12 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ +
                                      lVar39 * 4);
LAB_0017acb5:
                    uVar10 = TTA::MemMerge(uVar10,uVar12);
                    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) =
                         uVar10;
                  }
                  else {
LAB_0017992e:
                    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar17 = *(undefined4 *)
                              (lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4);
                    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
                    *piVar18 = *piVar18 + 1;
                    *(undefined4 *)
                     (lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) = uVar17;
                  }
                }
              }
            }
          }
          goto LAB_0017a54f;
        }
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + uVar20 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(uVar20 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) == '\0'
           ) {
          uVar10 = TTA::MemNewLabel();
          plVar25 = local_270;
        }
        else {
          piVar18 = (int *)(*local_288 * (long)local_150 + local_2c0 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_150 + local_338._24_8_ +
                            uVar20 * 4);
        }
LAB_001790bd:
        iVar11 = (int)uVar27;
        piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
LAB_00179402:
        *piVar18 = *piVar18 + 1;
        *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) = uVar10;
        uVar10 = iVar11 + 2;
        uVar27 = (ulong)uVar10;
      } while ((int)uVar10 < (int)local_198);
    }
    lVar39 = (long)(int)local_160;
    lVar36 = (long)(int)uVar10;
    piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + lVar36 * 4);
    *piVar18 = *piVar18 + 1;
    cVar1 = *(char *)(lVar36 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_);
    if ((int)local_198 < (int)uVar10) {
      if (cVar1 == '\0') {
LAB_0017a4dd:
        piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar36 * 4);
        *piVar18 = *piVar18 + 1;
        *(undefined4 *)(lVar39 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar36 * 4) = 0;
      }
      else {
LAB_0017a445:
        lVar39 = (long)(int)uVar10;
        piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + lVar39 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar39 + (long)(iVar3 + -2) * *(long *)local_260._80_8_ + local_260._24_8_) ==
            '\0') {
          uVar10 = TTA::MemNewLabel();
          lVar16 = (long)(int)local_160;
          lVar36 = *local_288 * lVar16 + local_2c0;
        }
        else {
          piVar18 = (int *)(*local_288 * (long)(iVar3 + -3) + local_2c0 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          lVar16 = (long)(int)local_160;
          lVar36 = *local_288 * lVar16 + local_2c0;
          uVar10 = *(uint *)((long)(iVar3 + -3) * *(long *)local_338._80_8_ + local_338._24_8_ +
                            lVar39 * 4);
        }
        piVar18 = (int *)(lVar36 + lVar39 * 4);
        *piVar18 = *piVar18 + 1;
        *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) = uVar10;
      }
    }
    else {
      if (cVar1 == '\0') {
LAB_0017a34f:
        lVar39 = (long)(int)local_160;
        lVar36 = (long)(int)uVar10;
        piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 4 + lVar36 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar36 + 1 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) == '\0')
        goto LAB_0017a4dd;
      }
      lVar39 = (long)(int)uVar10;
      piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + 4 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar39 + 1 + (long)(iVar3 + -2) * *(long *)local_260._80_8_ + local_260._24_8_)
          == '\0') goto LAB_0017a445;
      piVar18 = (int *)(*local_288 * (long)(iVar3 + -3) + local_2c0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      uVar17 = *(undefined4 *)
                ((long)(iVar3 + -3) * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4);
      piVar18 = (int *)(*local_288 * (long)(int)local_160 + local_2c0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      *(undefined4 *)
       ((long)(int)local_160 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) = uVar17;
    }
  }
  goto LAB_0017a54f;
LAB_0016d306:
  piVar18 = (int *)(local_2c0 + (long)iVar11 * 4);
  *piVar18 = *piVar18 + 1;
  *(undefined4 *)(local_338._24_8_ + (long)iVar11 * 4) = 0;
  iVar9 = iVar11;
LAB_0016d365:
  iVar11 = iVar9 + 2;
  if ((int)local_198 <= iVar11) goto code_r0x0016d375;
  goto LAB_0016d1d1;
code_r0x0016d651:
  uVar27 = lVar39 + lVar35 & 0xffffffff;
  goto LAB_0016d4bb;
LAB_001758e9:
  piVar18 = (int *)(*local_1b0 * lVar36 + local_1e8 + local_190 * 4 + 8 + lVar41 * 4);
  *piVar18 = *piVar18 + 1;
  uVar27 = (long)local_180 + lVar41;
  if (*(char *)(local_190 + lVar41 + 2 + *(long *)local_260._80_8_ * lVar36 + local_260._24_8_) ==
      '\0') {
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_0016e0b8;
  }
  uVar20 = (ulong)plVar34 | 1;
  lVar16 = lVar31 + 0x300000000 >> 0x20;
  piVar18 = (int *)((lVar31 + 0x300000000 >> 0x1e) + *local_1b0 * (long)plVar34 + local_1e8);
  *piVar18 = *piVar18 + 1;
  lVar33 = lVar31 + 0x100000000 >> 0x20;
  if (*(char *)(lVar16 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0') {
    piVar18 = (int *)(local_1e8 + *local_1b0 * uVar20 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    plVar19 = local_268;
    if (*(char *)(lVar33 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar33 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
      {
        uVar10 = TTA::MemNewLabel();
        lVar16 = *local_288;
      }
      else {
        piVar18 = (int *)(lVar30 + *local_288 * (long)plVar34 + local_2c0);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(lVar30 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
        lVar16 = *local_288;
      }
      piVar18 = (int *)(lVar16 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4);
      *piVar18 = *piVar18 + 1;
      *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + local_190 * 4 + 8 +
               lVar41 * 4) = uVar10;
      uVar27 = uVar27 & 0xffffffff;
      plVar25 = local_270;
      goto LAB_0016f951;
    }
    piVar18 = (int *)(lVar30 + *local_288 * (long)plVar34 + local_2c0);
    *piVar18 = *piVar18 + 1;
    uVar17 = *(undefined4 *)(lVar30 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4);
    *piVar18 = *piVar18 + 1;
    *(undefined4 *)
     (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + local_190 * 4 + 8 + lVar41 * 4)
         = uVar17;
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_0016f951;
  }
  piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34 + lVar33 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar33 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0') {
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_00175a15;
  }
  piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + lVar33 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar33 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_0016e0f8;
  }
  piVar18 = (int *)(*local_1b0 * local_160 + local_1e8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + *(long *)local_260._80_8_ * local_160 + local_260._24_8_) != '\0') {
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_00175a56;
  }
  piVar18 = (int *)((lVar31 + 0x400000000 >> 0x1e) + *local_1b0 * local_160 + local_1e8);
  *piVar18 = *piVar18 + 1;
  if (*(char *)((lVar31 + 0x400000000 >> 0x20) +
               local_160 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0') {
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_00173a19;
  }
  piVar18 = (int *)(*local_1b0 * (long)local_270 + local_1e8 + local_190 * 4 + 8 + lVar41 * 4);
  *piVar18 = *piVar18 + 1;
  uVar38 = local_190 + lVar41 + 2;
  if (*(char *)(lVar41 + 2 +
               *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_ + local_190) == '\0')
  {
    piVar18 = (int *)(lVar30 + *local_288 * (long)plVar34 + local_2c0);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(lVar30 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *(long *)local_338._80_8_;
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_001713a6;
  }
  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + local_190 * 4 + 8 +
                    lVar41 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + local_190 * 4 + 8 + lVar41 * 4);
  *piVar18 = *piVar18 + 1;
  lVar16 = *(long *)local_338._80_8_;
  uVar27 = uVar27 & 0xffffffff;
LAB_0016e2da:
  *(uint *)(lVar16 * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
  lVar16 = (long)(int)uVar27;
  uVar38 = lVar16 + 2;
  plVar19 = plVar37;
  if ((int)uVar38 < (int)local_198) {
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0'
       ) {
      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_00171735;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
          '\0') {
LAB_00171950:
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar17 = *(undefined4 *)
                  (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        *(undefined4 *)
         (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + 8 + lVar16 * 4) = uVar17;
        uVar27 = uVar38 & 0xffffffff;
        plVar19 = plVar37;
        goto LAB_0016f951;
      }
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) != '\0') {
        piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar20 = uVar38;
        if (*(char *)(lVar16 + 2 +
                     *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_) != '\0') {
LAB_00173448:
          uVar27 = uVar20 & 0xffffffff;
          uVar38 = (ulong)(int)uVar20;
          piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          cVar1 = *(char *)((uVar38 - 1) +
                           *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_);
          goto joined_r0x00173488;
        }
LAB_001716b4:
        piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                          lVar16 * 4);
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                local_338._24_8_ + lVar16 * 4));
        uVar27 = uVar38 & 0xffffffff;
        goto LAB_00171b25;
      }
LAB_0016e677:
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0x10 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 4 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_00171a16;
      lVar33 = (long)plVar34 + -2;
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
      goto LAB_001717c5;
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
      goto LAB_001717c5;
LAB_0017308e:
      uVar27 = uVar38 & 0xffffffff;
      lVar16 = (long)plVar34 + -2;
      iVar11 = (int)uVar38;
      uVar38 = (ulong)iVar11;
      piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      lVar33 = (long)(iVar11 + 2);
      if (*(char *)((uVar38 - 1) + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
      goto LAB_00173ae8;
      piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4);
      uVar38 = (ulong)iVar11;
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        uVar38 * 4);
LAB_001745c6:
      uVar10 = TTA::MemMerge(uVar10,uVar12);
      lVar16 = *local_288;
LAB_00171e8a:
      piVar18 = (int *)(lVar16 * (long)plVar34 + local_2c0 + uVar38 * 4);
LAB_00171e9a:
      *piVar18 = *piVar18 + 1;
      *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
      iVar11 = (int)uVar27;
      uVar10 = iVar11 + 2;
      if ((int)uVar10 < (int)local_198) {
        lVar35 = (long)iVar11;
        local_190 = lVar35 + 2;
        lVar31 = lVar35 << 0x20;
        lVar16 = lVar35 * 4;
        lVar33 = 8;
        lVar41 = 0;
        while( true ) {
          piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar16 + 8 + lVar41 * 4);
          *piVar18 = *piVar18 + 1;
          lVar24 = lVar31 >> 0x1e;
          iVar9 = (int)lVar41;
          iVar13 = (int)local_190;
          plVar19 = local_268;
          plVar25 = local_270;
          plVar37 = local_268;
          if (*(char *)(lVar41 + 2 +
                       *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_ + lVar35) ==
              '\0') {
            piVar18 = (int *)(*local_1b0 * lVar36 + local_1e8 + lVar16 + 8 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 2 +
                         *(long *)local_260._80_8_ * lVar36 + local_260._24_8_ + lVar35) == '\0') {
              uVar27 = local_190 + lVar41;
              piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34 +
                               (lVar31 + 0x300000000 >> 0x1e));
              *piVar18 = *piVar18 + 1;
              lVar16 = lVar31 + 0x300000000 >> 0x20;
              if (*(char *)(lVar16 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
                  == '\0') goto LAB_0016e7cd;
              lVar33 = (long)plVar34 + -1;
              piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              uVar38 = lVar41 + lVar35 + 2;
              if (*(char *)(lVar16 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0')
              {
                piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar35 * 4 + 8 + lVar41 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                   lVar35 * 4 + 8 + lVar41 * 4);
                goto LAB_00171b25;
              }
              piVar18 = (int *)((lVar31 + 0x400000000 >> 0x1e) + *local_1b0 * lVar33 + local_1e8);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((lVar31 + 0x400000000 >> 0x20) +
                           lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
              goto LAB_0016e1bd;
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar35 * 4 + 8 + lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar35 * 4
                                 + 8 + lVar41 * 4);
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar35 * 4 + 8 + lVar41 * 4
                               );
              *piVar18 = *piVar18 + 1;
              lVar16 = *(long *)local_338._80_8_;
              goto LAB_0016e2da;
            }
            piVar18 = (int *)(local_1e8 + lVar16 + *local_1b0 * (long)plVar34 + 0xc + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 3 +
                         *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_ + lVar35) ==
                '\0') {
              piVar18 = (int *)(lVar24 + *local_288 * (long)plVar34 + local_2c0);
              *piVar18 = *piVar18 + 1;
              uVar17 = *(undefined4 *)
                        (lVar24 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar35 * 4 + 8 + lVar41 * 4
                               );
              *piVar18 = *piVar18 + 1;
              uVar27 = (ulong)(uint)(iVar13 + iVar9);
              *(undefined4 *)
               (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar35 * 4 + 8 +
               lVar41 * 4) = uVar17;
              goto LAB_0016f951;
            }
            piVar18 = (int *)(*local_1b0 * (long)local_270 + local_1e8 + lVar16 + 0xc + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 3 +
                         *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_ + lVar35) !=
                '\0') {
              uVar27 = (ulong)(uint)(iVar13 + iVar9);
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar35 * 4 + 8 + lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar35 * 4
                                 + 8 + lVar41 * 4);
              uVar38 = lVar41 + lVar35 + 2;
              goto LAB_00171b25;
            }
          }
          else {
            piVar18 = (int *)(*local_1b0 * (long)local_270 + local_1e8 + lVar16 + 0xc + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 3 +
                         *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_ + lVar35) !=
                '\0') {
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar35 * 4 + 8 + lVar41 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar35 * 4
                                 + 8 + lVar41 * 4);
              uVar20 = lVar41 + lVar35 + 2;
              uVar38 = (ulong)(uint)(iVar13 + iVar9);
              goto LAB_00174ef0;
            }
            piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar16 + 0xc + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar41 + 3 +
                         *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_ + lVar35) ==
                '\0') {
              piVar18 = (int *)(lVar24 + *local_288 * (long)plVar34 + local_2c0);
              *piVar18 = *piVar18 + 1;
              uVar27 = (ulong)(uint)(iVar13 + iVar9);
              uVar10 = *(uint *)(lVar24 + *(long *)local_338._80_8_ * (long)plVar34 +
                                          local_338._24_8_);
              uVar38 = lVar41 + lVar35 + 2;
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar35 * 4 + lVar33);
              goto LAB_00173b76;
            }
          }
          piVar18 = (int *)(*local_1b0 * (long)local_270 + local_1e8 + lVar16 + 0x10 + lVar41 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar41 + 4 +
                       *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_ + lVar35) ==
              '\0') break;
          piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + lVar16 + 0xc + lVar41 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar41 + 3 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_ + lVar35)
              == '\0') {
            piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar16 + 0x10 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar16 + 0x10
                              + lVar41 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                    local_338._24_8_ + lVar16 + lVar41 * 4));
          }
          else {
            piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar16 + 0x10 + lVar41 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar16 + 0x10
                              + lVar41 * 4);
          }
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 + 8 + lVar41 * 4);
          *piVar18 = *piVar18 + 1;
          *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 + 8 +
                   lVar41 * 4) = uVar10;
          lVar31 = lVar31 + 0x200000000;
          lVar24 = lVar41 + lVar35;
          lVar41 = lVar41 + 2;
          lVar33 = lVar33 + 8;
          if (local_178 <= lVar24 + 4) {
            iVar11 = iVar11 + (int)lVar41;
            uVar10 = (int)local_190 + (int)lVar41;
            plVar25 = local_270;
            plVar19 = local_268;
            goto LAB_001722a0;
          }
        }
        piVar18 = (int *)(lVar24 + *local_288 * (long)plVar34 + local_2c0);
        *piVar18 = *piVar18 + 1;
        local_168 = (ulong)(uint)(iVar13 + iVar9);
        uVar10 = *(uint *)(lVar24 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
        uVar38 = lVar41 + lVar35 + 2;
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar35 * 4 + lVar33);
LAB_0017290d:
        plVar19 = local_268;
        *piVar18 = *piVar18 + 1;
        *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + uVar38 * 4) =
             uVar10;
        iVar11 = (int)local_168;
        uVar10 = iVar11 + 2;
        uVar27 = local_168;
        if ((int)uVar10 < (int)local_198) {
          local_158 = (long *)((long)plVar34 + -1);
          plVar37 = (long *)(long)iVar11;
          local_170 = (long)plVar37 + 2;
          lVar35 = (long)plVar37 << 0x20;
          lVar16 = local_1e8 + (long)plVar37 * 4;
          lVar24 = local_2c0 + (long)plVar37 * 4;
          lVar41 = (long)plVar37 * 4 + local_338._24_8_;
          local_160 = local_1e8 + (long)plVar37 * 4 + 0x10;
          local_190 = local_1e8 + *local_1b0 * (long)plVar34 + (long)plVar37 * 4 + 8;
          lVar33 = *(long *)local_260._80_8_;
          lVar32 = 8;
          lVar31 = 0;
          do {
            piVar18 = (int *)(local_190 + lVar31 * 4);
            *piVar18 = *piVar18 + 1;
            lVar29 = lVar35 >> 0x1e;
            iVar13 = (int)lVar31;
            lVar30 = lVar35 >> 0x20;
            iVar9 = (int)local_170;
            local_180 = plVar37;
            if (*(char *)((long)plVar37 + lVar31 + local_260._24_8_ + lVar33 * (long)plVar34 + 2) ==
                '\0') {
              piVar18 = (int *)(*local_1b0 * lVar36 + lVar16 + 8 + lVar31 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((long)plVar37 +
                           lVar31 + 2 + *(long *)local_260._80_8_ * lVar36 + local_260._24_8_) ==
                  '\0') {
                uVar27 = (ulong)(uint)(iVar9 + iVar13);
                goto LAB_00171a6c;
              }
              piVar18 = (int *)(*local_1b0 * (long)plVar34 + lVar16 + 0xc + lVar31 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((long)plVar37 +
                           lVar31 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_
                           ) == '\0') {
                piVar18 = (int *)(lVar29 + *local_288 * (long)plVar34 + local_2c0);
                *piVar18 = *piVar18 + 1;
                uVar17 = *(undefined4 *)
                          (lVar29 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + (long)plVar37 * 4 + 8 +
                                 lVar31 * 4);
                *piVar18 = *piVar18 + 1;
                uVar27 = (ulong)(uint)(iVar9 + iVar13);
                *(undefined4 *)
                 (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + (long)plVar37 * 4 +
                  8 + lVar31 * 4) = uVar17;
                goto LAB_0016f951;
              }
              piVar18 = (int *)(*local_1b0 * (long)plVar25 + lVar16 + 0xc + lVar31 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((long)plVar37 +
                           lVar31 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_
                           ) != '\0') {
                uVar20 = local_170 + lVar31;
                piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + (long)plVar37 * 4 + 8 +
                                 lVar31 * 4);
                *piVar18 = *piVar18 + 1;
                uVar38 = (long)plVar37 + lVar31 + 2;
                if (*(char *)((long)plVar37 +
                             *(long *)local_260._80_8_ * lVar39 + local_260._24_8_ + lVar31 + 2) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 8 +
                                   lVar31 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)plVar37 * 4 + 8 + lVar31 * 4);
                  piVar18 = (int *)(lVar29 + *local_288 * (long)plVar34 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar29 + *(long *)local_338._80_8_ *
                                                                   (long)plVar34 + local_338._24_8_)
                                        );
                  uVar27 = uVar20 & 0xffffffff;
                  plVar19 = local_268;
                  goto LAB_00171b25;
                }
                piVar18 = (int *)(lVar29 + *local_1b0 * (long)local_158 + local_1e8);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar30 + *(long *)local_260._80_8_ * (long)local_158 +
                                       local_260._24_8_) == '\0') {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 8 +
                                   lVar31 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)plVar37 * 4 + 8 + lVar31 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar30 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34
                                                          + local_338._24_8_ + lVar30 * 4));
                  uVar27 = uVar20 & 0xffffffff;
                  goto LAB_00171b25;
                }
                goto LAB_00173448;
              }
            }
            else {
              piVar18 = (int *)(*local_1b0 * (long)plVar25 + lVar16 + 0xc + lVar31 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((long)plVar37 +
                           lVar31 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_
                           ) != '\0') {
                uVar38 = local_170 + lVar31;
                piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + (long)plVar37 * 4 + 8 +
                                 lVar31 * 4);
                *piVar18 = *piVar18 + 1;
                uVar20 = (long)plVar37 + lVar31 + 2;
                if (*(char *)((long)plVar37 +
                             *(long *)local_260._80_8_ * lVar39 + local_260._24_8_ + lVar31 + 2) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 8 +
                                   lVar31 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)plVar37 * 4 + 8 + lVar31 * 4);
                  piVar18 = (int *)(lVar29 + *local_288 * (long)plVar34 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar29 + *(long *)local_338._80_8_ *
                                                                   (long)plVar34 + local_338._24_8_)
                                        );
                  uVar38 = uVar38 & 0xffffffff;
                  plVar19 = local_268;
                }
                else {
                  piVar18 = (int *)(lVar29 + *local_1b0 * (long)local_158 + local_1e8);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar30 + *(long *)local_260._80_8_ * (long)local_158 +
                                         local_260._24_8_) != '\0') goto LAB_0016e3c4;
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 8 +
                                   lVar31 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)plVar37 * 4 + 8 + lVar31 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar30 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34
                                                          + local_338._24_8_ + lVar30 * 4));
                  uVar38 = uVar38 & 0xffffffff;
                }
                goto LAB_00174ef0;
              }
              piVar18 = (int *)(*local_1b0 * (long)plVar34 + lVar16 + 0xc + lVar31 * 4);
              *piVar18 = *piVar18 + 1;
              plVar25 = local_270;
              if (*(char *)((long)plVar37 +
                           lVar31 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_
                           ) == '\0') goto LAB_00173215;
            }
            piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_160 + lVar31 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)((long)plVar37 +
                         lVar31 + 4 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                != '\0') {
              uVar38 = local_170 + lVar31;
              piVar18 = (int *)((lVar35 + 0x300000000 >> 0x1e) +
                               *local_1b0 * ((long)plVar34 + -2) + local_1e8);
              *piVar18 = *piVar18 + 1;
              local_190 = (long)plVar37 + lVar31 + 2;
              if (*(char *)((lVar35 + 0x300000000 >> 0x20) +
                           ((long)plVar34 + -2) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                  '\0') {
                piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 0x10 +
                                 lVar31 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                   (long)plVar37 * 4 + 0x10 + lVar31 * 4);
                piVar18 = (int *)(lVar29 + *local_288 * (long)plVar34 + local_2c0);
                *piVar18 = *piVar18 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar29 + *(long *)local_338._80_8_ *
                                                                 (long)plVar34 + local_338._24_8_));
                lVar16 = *local_288 * (long)plVar34 + local_2c0 + (long)plVar37 * 4;
              }
              else {
                piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + (long)plVar37 * 4 + 8 +
                                 lVar31 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)((long)plVar37 +
                             lVar31 + 2 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 0x10 +
                                   lVar31 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)plVar37 * 4 + 0x10 + lVar31 * 4);
                  piVar18 = (int *)(lVar29 + *local_288 * (long)plVar34 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar12 = *(uint *)(lVar29 + *(long *)local_338._80_8_ * (long)plVar34 +
                                              local_338._24_8_);
                }
                else {
                  piVar18 = (int *)(lVar29 + *local_1b0 * (long)local_158 + local_1e8);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar30 + (long)local_158 * *(long *)local_260._80_8_ +
                                         local_260._24_8_) != '\0') goto LAB_0017308e;
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)plVar37 * 4 + 0x10 +
                                   lVar31 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)plVar37 * 4 + 0x10 + lVar31 * 4);
                  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar30 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ +
                                    lVar30 * 4);
                }
                uVar10 = TTA::MemMerge(uVar10,uVar12);
                lVar16 = *local_288 * (long)plVar34 + local_2c0 + (long)plVar37 * 4;
              }
              piVar18 = (int *)(lVar16 + lVar32);
              uVar27 = uVar38 & 0xffffffff;
              plVar19 = local_268;
              uVar38 = local_190;
              goto LAB_00171e9a;
            }
            piVar18 = (int *)(*local_288 * (long)plVar34 + lVar24 + lVar31 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)
                      (*(long *)local_338._80_8_ * (long)plVar34 + lVar41 + lVar31 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + lVar24 + 8 + lVar31 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + lVar41 + 8 + lVar31 * 4) =
                 uVar17;
            lVar35 = lVar35 + 0x200000000;
            lVar29 = lVar31 + 4;
            lVar31 = lVar31 + 2;
            lVar32 = lVar32 + 8;
            plVar25 = local_270;
            if (local_178 <= (long)plVar37 + lVar29) {
              uVar27 = (ulong)(uint)(iVar11 + (int)lVar31);
              uVar10 = iVar9 + (int)lVar31;
              plVar37 = local_268;
              break;
            }
          } while( true );
        }
        uVar38 = (ulong)uVar10;
        plVar19 = plVar37;
        if ((int)local_198 < (int)uVar10) goto LAB_00172bc9;
        lVar33 = (long)(int)uVar10;
        piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        lVar16 = (long)(int)uVar27;
        if (*(char *)(lVar33 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0'
           ) {
          piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar33 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                       ) == '\0') goto LAB_00172ed9;
          piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
              != '\0') goto LAB_00172cf2;
        }
        else {
LAB_00172cf2:
          piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar16 + 3 +
                       ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
          {
            lVar35 = (long)plVar34 + -2;
            piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar35 + local_260._24_8_) != '\0') {
LAB_00174157:
              lVar33 = (long)(int)uVar38;
              piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + -8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              plVar37 = plVar19;
              if (*(char *)(lVar33 + -2 +
                           ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                  '\0') goto LAB_001741de;
              goto LAB_00174194;
            }
            piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(lVar35 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
            *piVar18 = *piVar18 + 1;
            uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ +
                              lVar16 * 4);
            goto LAB_0017423f;
          }
        }
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4
                          );
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        goto LAB_00175878;
      }
LAB_001722a0:
      if ((int)local_198 < (int)uVar10) goto LAB_00172bc9;
      lVar33 = (long)(int)uVar10;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      lVar16 = (long)iVar11;
      if (*(char *)(lVar33 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
      {
        piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        cVar1 = *(char *)(lVar33 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ +
                                   local_260._24_8_);
        piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        cVar2 = *(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
        ;
        if (cVar1 == '\0') {
          if (cVar2 == '\0') goto LAB_0017580a;
LAB_00172762:
          piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          lVar16 = *local_288 * (long)plVar34 + local_2c0;
          uVar17 = *(undefined4 *)
                    (((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                    lVar33 * 4);
          goto LAB_00172c92;
        }
        if (cVar2 != '\0') goto LAB_001722ef;
LAB_001723fe:
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar17 = *(undefined4 *)
                  (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
      }
      else {
LAB_001722ef:
        piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + 3 +
                     ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
        goto LAB_001723fe;
        piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        uVar17 = *(undefined4 *)
                  (((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4)
        ;
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
      }
      *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
           uVar17;
      goto LAB_00175894;
    }
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_)
        == '\0') {
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
          '\0') goto LAB_001719c0;
      goto LAB_0016e677;
    }
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    uVar20 = uVar38;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_)
        == '\0') {
LAB_00171449:
      piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                        lVar16 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                              local_338._24_8_ + lVar16 * 4));
      uVar38 = uVar20 & 0xffffffff;
      plVar19 = plVar37;
      goto LAB_00174ef0;
    }
LAB_0016e3c4:
    uVar27 = uVar38 & 0xffffffff;
    uVar20 = (ulong)(int)uVar38;
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    cVar1 = *(char *)((uVar20 - 1) +
                     *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_);
joined_r0x0017398c:
    uVar38 = uVar27;
    if (cVar1 != '\0') goto LAB_00174ec0;
LAB_00173cf5:
    piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                      uVar20 * 4);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                            local_338._24_8_ + -8 + uVar20 * 4));
    plVar25 = local_270;
    goto LAB_00174ef0;
  }
  if ((int)local_198 < (int)uVar38) {
LAB_001714cc:
    uVar10 = (uint)uVar38;
LAB_00172bc9:
    lVar33 = (long)(int)uVar10;
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar33 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0') {
LAB_00172c06:
      lVar33 = (long)(int)uVar10;
      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar33 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
          '\0') {
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
             0;
        goto LAB_00175894;
      }
    }
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *local_288 * (long)plVar34 + local_2c0;
    uVar17 = *(undefined4 *)
              (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 + lVar33 * 4);
LAB_00172c92:
    piVar18 = (int *)(lVar16 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
         uVar17;
    goto LAB_00175894;
  }
  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
  {
    piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
        == '\0') {
LAB_00172ed9:
      uVar10 = (uint)uVar38;
      lVar33 = (long)(int)uVar10;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      plVar19 = plVar37;
      if (*(char *)(lVar33 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
          '\0') goto LAB_0017580a;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar33 + 1 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_0017584a;
      goto LAB_0017568e;
    }
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0'
       ) goto LAB_0016e454;
  }
  else {
LAB_0016e454:
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_)
        != '\0') {
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_
                   ) == '\0') {
LAB_001746e1:
        piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                          lVar16 * 4);
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                local_338._24_8_ + lVar16 * 4));
        lVar33 = *local_288 * (long)plVar34 + local_2c0;
        plVar19 = plVar37;
LAB_00174771:
        piVar18 = (int *)(lVar33 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + 8 + lVar16 * 4) =
             uVar10;
        goto LAB_00175894;
      }
LAB_00174194:
      lVar33 = (long)(int)uVar38;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      plVar37 = plVar19;
      if (*(char *)(lVar33 + -1 +
                   *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_) != '\0')
      goto LAB_0017557f;
LAB_001741de:
      piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                        lVar33 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        lVar33 * 4);
      goto LAB_0017423f;
    }
  }
LAB_001718e3:
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  lVar33 = *local_288 * (long)plVar34 + local_2c0;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
LAB_0017192d:
  piVar18 = (int *)(lVar33 + 8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + 8 + lVar16 * 4) = uVar10;
  plVar19 = plVar37;
  goto LAB_00175894;
LAB_00173215:
  piVar18 = (int *)(lVar29 + *local_288 * (long)plVar34 + local_2c0);
  *piVar18 = *piVar18 + 1;
  uVar27 = (ulong)(uint)(iVar9 + iVar13);
  uVar10 = *(uint *)(lVar29 + *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + (long)plVar37 * 4 + lVar32);
  uVar38 = (long)plVar37 + lVar31 + 2;
LAB_00173b76:
  *piVar18 = *piVar18 + 1;
  *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
  lVar16 = (long)(int)uVar27;
  uVar38 = lVar16 + 2;
  uVar27 = uVar38;
  plVar37 = plVar19;
  if ((int)local_198 <= (int)uVar38) {
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    cVar1 = *(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_);
    if ((int)local_198 < (int)uVar38) {
      if (cVar1 == '\0') {
LAB_00174281:
        lVar16 = (long)(int)uVar38;
        piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
            == '\0') {
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4)
               = 0;
          goto LAB_00175894;
        }
LAB_001742c3:
        lVar33 = (long)(int)uVar38;
        piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + -4 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar33 + -1 +
                     ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
        goto LAB_0017584a;
LAB_00174307:
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        lVar35 = *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_;
        lVar16 = *local_288;
        plVar37 = plVar19;
LAB_00174341:
        lVar16 = lVar16 * (long)plVar34 + local_2c0;
        uVar10 = *(uint *)(lVar35 + -8 + lVar33 * 4);
        goto LAB_00175875;
      }
      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 1 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_0016de7d;
    }
    else {
      if (cVar1 == '\0') {
        piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + 2 +
                     ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
          uVar27 = uVar38 & 0xffffffff;
          goto LAB_001757c7;
        }
        piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
            '\0') goto LAB_001742c3;
      }
      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 1 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') {
        uVar27 = uVar38 & 0xffffffff;
        goto LAB_0016dcfe;
      }
      lVar33 = (long)plVar34 + -1;
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
        piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
        goto LAB_001746e1;
LAB_00173eec:
        uVar10 = (uint)uVar38;
        lVar33 = (long)(int)uVar10;
        piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        plVar37 = plVar19;
        if (*(char *)(lVar33 + -1 +
                     *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_) != '\0')
        goto LAB_0017553c;
        goto LAB_001741de;
      }
    }
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_)
        != '\0') goto LAB_00174157;
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    lVar33 = *local_288 * (long)plVar34 + local_2c0;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
    goto LAB_00174771;
  }
  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  uVar20 = (ulong)plVar34 | 1;
  if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
  {
    piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * uVar20 + local_260._24_8_) == '\0') {
      uVar27 = uVar38 & 0xffffffff;
      goto LAB_0016e0b8;
    }
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0'
       ) {
      uVar27 = uVar38 & 0xffffffff;
      goto LAB_0016f875;
    }
    piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 4 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 1 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
      uVar27 = uVar38 & 0xffffffff;
      goto LAB_0016e0f8;
    }
    lVar33 = (long)plVar34 + -1;
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
      goto LAB_001740cc;
      goto LAB_001716b4;
    }
  }
  else {
    piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 4 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 1 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
      uVar27 = uVar38 & 0xffffffff;
      goto LAB_0016ddea;
    }
    lVar33 = (long)plVar34 + -1;
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
      piVar18 = (int *)(local_1e8 + *local_1b0 * lVar33 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar20 = uVar38;
      if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
      goto LAB_00171449;
LAB_00173caf:
      uVar27 = uVar38 & 0xffffffff;
      uVar20 = (ulong)(int)uVar38;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      uVar38 = uVar27;
      if (*(char *)((uVar20 - 1) +
                   *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_) == '\0')
      goto LAB_00173cf5;
LAB_00173910:
      uVar20 = (ulong)(int)uVar27;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(uVar20 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
          '\0') goto LAB_00174ec0;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      cVar1 = *(char *)(uVar20 + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_
                       );
      goto joined_r0x0017398c;
    }
    piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34 + 0xc + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0'
       ) {
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0') {
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4
                          );
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        lVar16 = *(long *)local_338._80_8_;
        uVar27 = uVar38 & 0xffffffff;
        goto LAB_0016f0bc;
      }
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
      goto LAB_00174822;
      piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                        lVar16 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                              local_338._24_8_ + lVar16 * 4));
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      lVar16 = *(long *)local_338._80_8_;
      uVar27 = uVar38 & 0xffffffff;
      goto LAB_00170820;
    }
  }
  lVar33 = (long)plVar34 + -1;
  piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0x10 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 4 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0') {
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
        piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                          lVar16 * 4);
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                local_338._24_8_ + lVar16 * 4));
        piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        lVar16 = *(long *)local_338._80_8_;
        uVar27 = uVar38 & 0xffffffff;
      }
      else {
LAB_00174988:
        uVar27 = uVar38 & 0xffffffff;
        uVar38 = (ulong)(int)uVar38;
        piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + uVar38 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)((uVar38 - 1) +
                     *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_) == '\0') {
LAB_0016f60e:
          piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                            uVar38 * 4);
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                  local_338._24_8_ + -8 + uVar38 * 4));
          lVar16 = *local_288 * (long)plVar34 + local_2c0;
        }
        else {
LAB_0016e27f:
          piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          lVar16 = *local_288 * (long)plVar34 + local_2c0;
          uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                            uVar38 * 4);
        }
        piVar18 = (int *)(lVar16 + uVar38 * 4);
        *piVar18 = *piVar18 + 1;
        lVar16 = *(long *)local_338._80_8_;
        plVar37 = plVar19;
      }
      goto LAB_0016e2da;
    }
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
LAB_00174c97:
    lVar16 = *(long *)local_338._80_8_;
    uVar27 = uVar38 & 0xffffffff;
    plVar37 = plVar19;
LAB_001713a6:
    *(uint *)(lVar16 * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
    lVar16 = (long)(int)uVar27;
    uVar38 = lVar16 + 2;
    plVar19 = plVar37;
    if ((int)local_198 <= (int)uVar38) {
      if ((int)local_198 < (int)uVar38) goto LAB_001714cc;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
          '\0') {
        piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + 2 +
                     ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
        goto LAB_00172ed9;
        piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
            '\0') goto LAB_001718e3;
      }
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_001718e3;
      piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                        lVar16 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                              local_338._24_8_ + lVar16 * 4));
      lVar33 = *local_288 * (long)plVar34 + local_2c0;
      goto LAB_0017192d;
    }
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0'
       ) {
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar20 = uVar38;
      if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) != '\0') goto LAB_00171449;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
          '\0') goto LAB_001719c0;
LAB_00171781:
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0x10 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 4 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_00171a16;
      goto LAB_001717c5;
    }
    piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
        != '\0') {
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
          '\0') goto LAB_00171950;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_00171781;
      goto LAB_001716b4;
    }
LAB_00171735:
    uVar27 = uVar38 & 0xffffffff;
    plVar19 = plVar37;
LAB_00171a6c:
    iVar11 = (int)uVar27;
    uVar38 = (ulong)iVar11;
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0'
       ) {
      lVar16 = (long)plVar34 + -1;
      piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
      goto LAB_00171af5;
      uVar38 = (ulong)iVar11;
      piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(uVar38 + 2 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
      goto LAB_00171dfe;
      uVar10 = TTA::MemNewLabel();
      uVar38 = (ulong)iVar11;
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      lVar16 = *(long *)local_338._80_8_;
      plVar37 = plVar19;
      goto LAB_001713a6;
    }
LAB_0016e7cd:
    uVar20 = (ulong)plVar34 | 1;
    iVar11 = (int)uVar27;
    lVar35 = (long)iVar11;
    lVar16 = *local_1b0;
    piVar18 = (int *)(lVar16 * uVar20 + local_1e8 + 4 + lVar35 * 4);
    *piVar18 = *piVar18 + 1;
    lVar33 = *(long *)local_260._80_8_;
    if (*(char *)(lVar35 + 1 + lVar33 * uVar20 + local_260._24_8_) == '\0') {
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar35 * 4) = 0
      ;
      uVar10 = iVar11 + 2;
      uVar27 = (ulong)uVar10;
      if ((int)local_198 <= (int)uVar10) {
        piVar18 = (int *)(local_1e8 + lVar16 * (long)plVar34 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        cVar1 = *(char *)(lVar35 + 2 + local_260._24_8_ + lVar33 * (long)plVar34);
        if ((int)local_198 < (int)uVar10) {
          plVar37 = plVar19;
          if (cVar1 == '\0') goto LAB_0016ea06;
        }
        else {
          if (cVar1 == '\0') goto LAB_0016ead9;
LAB_0016fea2:
          lVar16 = (long)plVar34 + -1;
          lVar33 = (long)(int)uVar10;
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          plVar37 = plVar19;
          if (*(char *)(lVar33 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
          {
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
            goto LAB_00172762;
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) !=
                '\0') goto LAB_00175e98;
            piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)
                      (((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                      lVar33 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)
             (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) = uVar17;
            goto LAB_00175894;
          }
        }
LAB_0016ffc8:
        lVar16 = (long)plVar34 + -1;
        lVar33 = (long)(int)uVar10;
        piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
        goto LAB_0017568e;
        piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        plVar19 = plVar37;
        if (*(char *)(lVar33 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
        goto LAB_0017584a;
        piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + -8 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        lVar35 = ((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_;
        lVar16 = *local_288;
        goto LAB_00174341;
      }
      piVar18 = (int *)(local_1e8 + lVar16 * (long)plVar34 + 8 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar35 + 2 + local_260._24_8_ + lVar33 * (long)plVar34) != '\0')
      goto LAB_0016ebfc;
LAB_0016e045:
      lVar16 = *local_1b0;
      lVar35 = (long)(int)uVar27;
      piVar18 = (int *)(lVar16 * ((ulong)plVar34 | 1) + local_1e8 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      lVar33 = *(long *)local_260._80_8_;
      if (*(char *)(lVar35 + ((ulong)plVar34 | 1) * lVar33 + local_260._24_8_) != '\0') {
        piVar18 = (int *)(local_1e8 + lVar16 * (long)plVar34 + 4 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 1 + local_260._24_8_ + lVar33 * (long)plVar34) == '\0')
        goto LAB_0016f901;
        goto LAB_0016e0f8;
      }
    }
    else {
      uVar10 = TTA::MemNewLabel();
      lVar16 = *local_288 * (long)plVar34 + local_2c0;
      piVar18 = (int *)(lVar16 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      lVar33 = *(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_;
      *(uint *)(lVar33 + lVar35 * 4) = uVar10;
      uVar10 = iVar11 + 2;
      uVar27 = (ulong)uVar10;
      plVar25 = local_270;
      if ((int)local_198 <= (int)uVar10) {
        lVar31 = *local_1b0;
        lVar24 = lVar31 * (long)plVar34 + local_1e8;
        piVar18 = (int *)(lVar24 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        lVar41 = *(long *)local_260._80_8_;
        lVar32 = lVar41 * (long)plVar34 + local_260._24_8_;
        cVar1 = *(char *)(lVar35 + 2 + lVar32);
        if ((int)local_198 < (int)uVar10) {
          if (cVar1 == '\0') goto LAB_00172c06;
LAB_0016fca8:
          lVar33 = (long)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + -4 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar33 + -1 +
                       ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
          {
            piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + -8 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            lVar16 = *local_288 * (long)plVar34 + local_2c0;
            uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                               -8 + lVar33 * 4);
            goto LAB_00170222;
          }
        }
        else {
          if (cVar1 != '\0') {
LAB_0016fb4a:
            lVar16 = (long)plVar34 + -1;
            lVar33 = (long)(int)uVar27;
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) ==
                '\0') goto LAB_0016fca8;
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
            goto LAB_001701dd;
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            lVar35 = (long)plVar34 + -2;
            if (*(char *)(lVar33 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                '\0') goto LAB_001701dd;
            piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar35 + local_260._24_8_) == '\0') {
              piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + -8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar35 + local_338._24_8_ + -8 +
                                lVar33 * 4);
              piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar35 * *(long *)local_338._80_8_ +
                                                      local_338._24_8_ + lVar33 * 4));
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                                lVar33 * 4);
            }
            else {
              piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(lVar35 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4)
              ;
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                                lVar33 * 4);
            }
            uVar10 = TTA::MemMerge(uVar10,uVar12);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar33 * 4);
            *piVar18 = *piVar18 + 1;
            *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar33 * 4) =
                 uVar10;
            goto LAB_00175894;
          }
          piVar18 = (int *)(local_1e8 + lVar31 * uVar20 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 2 + local_260._24_8_ + lVar41 * uVar20) == '\0') goto LAB_001757c7;
          piVar18 = (int *)(lVar24 + 0xc + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar32 + 3 + lVar35) == '\0') {
            piVar18 = (int *)(lVar16 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)(lVar33 + lVar35 * 4);
            piVar18 = (int *)(lVar16 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(lVar33 + 8 + lVar35 * 4) = uVar17;
            goto LAB_00175894;
          }
LAB_0017015a:
          lVar33 = (long)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + lVar33 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar33 + 1 +
                       ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
          goto LAB_001701dd;
        }
LAB_0017019a:
        lVar33 = (long)(int)uVar27;
        piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + lVar33 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar33 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_)
            == '\0') goto LAB_00174307;
        goto LAB_001701dd;
      }
      lVar31 = *local_1b0;
      lVar24 = lVar31 * (long)plVar34 + local_1e8;
      piVar18 = (int *)(lVar24 + 8 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      lVar41 = *(long *)local_260._80_8_;
      lVar32 = lVar41 * (long)plVar34 + local_260._24_8_;
      if (*(char *)(lVar35 + 2 + lVar32) != '\0') goto LAB_0016f9e4;
      piVar18 = (int *)(local_1e8 + lVar31 * uVar20 + 8 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar35 + 2 + local_260._24_8_ + lVar41 * uVar20) != '\0') {
        piVar18 = (int *)(lVar24 + 0xc + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar32 + 3 + lVar35) != '\0') goto LAB_0016f3b7;
        piVar18 = (int *)(lVar16 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        uVar17 = *(undefined4 *)(lVar33 + lVar35 * 4);
        piVar18 = (int *)(lVar16 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        *(undefined4 *)(lVar33 + 8 + lVar35 * 4) = uVar17;
        goto LAB_0016f951;
      }
    }
LAB_0016e0b8:
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + (long)(int)uVar27 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)((long)(int)uVar27 + 1 +
                 *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
    goto LAB_0016e7cd;
LAB_0016e0f8:
    uVar38 = (ulong)(int)uVar27;
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 1 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_)
        == '\0') goto LAB_0016e13b;
LAB_00171af5:
    piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                      uVar38 * 4);
LAB_00171b25:
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
    lVar16 = (long)(int)uVar27;
    uVar10 = (int)uVar27 + 2;
    uVar27 = (ulong)uVar10;
    if ((int)local_198 <= (int)uVar10) {
      if ((int)local_198 < (int)uVar10) goto LAB_00172bc9;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) !=
          '\0') goto LAB_001754fb;
      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) == '\0') goto LAB_001757c7;
      piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) !=
          '\0') goto LAB_001754fb;
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar17 = *(undefined4 *)
                (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      *(undefined4 *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + 8 + lVar16 * 4)
           = uVar17;
      goto LAB_00175894;
    }
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0'
       ) {
      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(lVar16 + 2 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_
                   ) != '\0') {
        piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
            '\0') {
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          uVar17 = *(undefined4 *)
                    (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)
           (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + 8 + lVar16 * 4) = uVar17;
LAB_0016f951:
          lVar16 = (long)(int)uVar27;
          uVar10 = (int)uVar27 + 2;
          uVar27 = (ulong)uVar10;
          if ((int)local_198 <= (int)uVar10) {
            piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
            *piVar18 = *piVar18 + 1;
            cVar1 = *(char *)(lVar16 + 2 +
                             *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_);
            if ((int)local_198 < (int)uVar10) {
              if (cVar1 == '\0') {
                uVar38 = (ulong)uVar10;
                goto LAB_00174281;
              }
              piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              plVar37 = plVar19;
              if (*(char *)(lVar16 + 1 +
                           ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                  '\0') goto LAB_0016ffc8;
              goto LAB_0016fca8;
            }
            if (cVar1 != '\0') {
              piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar16 + 1 +
                           ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                  '\0') goto LAB_0016fea2;
              goto LAB_0016fb4a;
            }
            uVar27 = (ulong)uVar10;
LAB_00170094:
            lVar16 = (long)(int)uVar27;
            piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + lVar16 * 4);
            *piVar18 = *piVar18 + 1;
            uVar38 = uVar27;
            if (*(char *)(lVar16 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ +
                                   local_260._24_8_) == '\0') {
LAB_00170c44:
              uVar27 = uVar38 & 0xffffffff;
              goto LAB_001757c7;
            }
            piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + lVar16 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(lVar16 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
                == '\0') goto LAB_001742c3;
LAB_00170113:
            iVar11 = (int)uVar27;
            piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + -4 + (long)iVar11 * 4)
            ;
            *piVar18 = *piVar18 + 1;
            uVar27 = uVar27 & 0xffffffff;
            if (*(char *)((long)iVar11 + -1 +
                         ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
                '\0') goto LAB_0016dcfe;
            goto LAB_0017015a;
          }
          piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
              == '\0') goto LAB_0016f2fb;
          piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar16 + 1 +
                       ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
          goto LAB_0016ebfc;
LAB_0016f9e4:
          lVar16 = (long)plVar34 + -1;
          iVar11 = (int)uVar27;
          uVar20 = (ulong)iVar11;
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
          {
            piVar18 = (int *)(local_1e8 + *local_1b0 * lVar16 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            uVar38 = uVar27;
            if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
            goto LAB_00173cf5;
            lVar35 = (long)iVar11;
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            lVar33 = (long)plVar34 + -2;
            if (*(char *)(lVar35 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                '\0') {
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + uVar20 * 4)
              ;
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                      local_338._24_8_ + -8 + lVar35 * 4));
            }
            else {
              piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + uVar20 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
              {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 +
                                  lVar35 * 4);
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar33 * *(long *)local_338._80_8_ +
                                                        local_338._24_8_ + uVar20 * 4));
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8
                                  + lVar35 * 4);
              }
              else {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ +
                                  uVar20 * 4);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8
                                  + lVar35 * 4);
              }
              uVar10 = TTA::MemMerge(uVar10,uVar12);
            }
            goto LAB_00174ef0;
          }
          piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar34 + 4 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          lVar33 = *local_1b0 * lVar16 + local_1e8;
          if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
              == '\0') {
            uVar38 = (ulong)iVar11;
            piVar18 = (int *)(lVar33 + -4 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)((uVar38 - 1) + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                '\0') {
LAB_00170728:
              uVar38 = (ulong)(int)uVar27;
              piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(uVar38 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ +
                                     local_260._24_8_) != '\0') {
                piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                   local_338._24_8_ + uVar38 * 4);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                        local_338._24_8_ + -8 + uVar38 * 4));
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
                *piVar18 = *piVar18 + 1;
                lVar16 = *(long *)local_338._80_8_;
                uVar27 = uVar27 & 0xffffffff;
                plVar19 = local_268;
LAB_00170820:
                do {
                  *(uint *)(lVar16 * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
                  lVar16 = (long)(int)uVar27;
                  uVar38 = lVar16 + 2;
                  uVar27 = uVar38;
                  if ((int)local_198 <= (int)uVar38) {
                    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    cVar1 = *(char *)(lVar16 + 2 +
                                     *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_);
                    if ((int)local_198 < (int)uVar38) {
                      if (cVar1 == '\0') goto LAB_00174281;
                      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 +
                                       lVar16 * 4);
                      *piVar18 = *piVar18 + 1;
                      if (*(char *)(lVar16 + 1 +
                                   ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ +
                                   local_260._24_8_) == '\0') goto LAB_0016de7d;
                    }
                    else {
                      if (cVar1 == '\0') {
                        piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 8 +
                                         lVar16 * 4);
                        *piVar18 = *piVar18 + 1;
                        if (*(char *)(lVar16 + 2 +
                                     ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ +
                                     local_260._24_8_) == '\0') goto LAB_00170c44;
                        piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4)
                        ;
                        *piVar18 = *piVar18 + 1;
                        if (*(char *)(lVar16 + 3 +
                                     *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_)
                            == '\0') goto LAB_001742c3;
                      }
                      piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 +
                                       lVar16 * 4);
                      *piVar18 = *piVar18 + 1;
                      if (*(char *)(lVar16 + 1 +
                                   ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ +
                                   local_260._24_8_) == '\0') {
                        uVar27 = uVar38 & 0xffffffff;
                        goto LAB_0016dcfe;
                      }
                      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc +
                                       lVar16 * 4);
                      *piVar18 = *piVar18 + 1;
                      if (*(char *)(lVar16 + 3 +
                                   ((long)plVar34 + -1) * *(long *)local_260._80_8_ +
                                   local_260._24_8_) != '\0') goto LAB_00173eec;
                    }
                    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 8 + lVar16 * 4
                                     );
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 2 +
                                 ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                                 ) != '\0') goto LAB_00174194;
                    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar17 = *(undefined4 *)
                              (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ +
                              lVar16 * 4);
                    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    *(undefined4 *)
                     (*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + 8 + lVar16 * 4)
                         = uVar17;
                    goto LAB_00175894;
                  }
                  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar20 = (ulong)plVar34 | 1;
                  if (*(char *)(lVar16 + 2 +
                               *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0'
                     ) {
                    piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 8 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * uVar20 + local_260._24_8_
                                 ) == '\0') {
                      uVar27 = uVar38 & 0xffffffff;
                      goto LAB_0016e0b8;
                    }
                    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 3 +
                                 *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) ==
                        '\0') {
                      uVar27 = uVar38 & 0xffffffff;
                      goto LAB_0016f875;
                    }
                    piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 4 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 1 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_
                                 ) == '\0') {
                      uVar27 = uVar38 & 0xffffffff;
                      goto LAB_0016e0f8;
                    }
                    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc +
                                     lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 3 +
                                 ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_
                                 ) != '\0') goto LAB_001740cc;
LAB_00170c89:
                    lVar33 = (long)plVar34 + -1;
                    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0x10 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 4 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_
                                 ) == '\0') {
                      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar16 * 4);
                      *piVar18 = *piVar18 + 1;
                      if (*(char *)(lVar16 + 2 +
                                   lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
                      goto LAB_00174988;
                      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
                      *piVar18 = *piVar18 + 1;
                      uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                         local_338._24_8_ + lVar16 * 4);
                      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
                      *piVar18 = *piVar18 + 1;
                      goto LAB_00174c97;
                    }
                    lVar35 = (long)plVar34 + -2;
                    piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + 0xc + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar35 + local_260._24_8_
                                 ) != '\0') goto LAB_00174513;
                    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    if (*(char *)(lVar16 + 2 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_
                                 ) != '\0') goto LAB_00174a40;
                    piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + 0x10 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = *(uint *)(lVar35 * *(long *)local_338._80_8_ + local_338._24_8_ + 0x10
                                      + lVar16 * 4);
                    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ *
                                                            (long)plVar34 + local_338._24_8_ +
                                                           lVar16 * 4));
                    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
                    uVar27 = uVar38 & 0xffffffff;
                    goto LAB_00171e9a;
                  }
                  piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + 4 + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar16 + 1 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_)
                      == '\0') goto LAB_00170ac3;
                  lVar33 = (long)plVar34 + -1;
                  piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_)
                      != '\0') goto LAB_00173caf;
                  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar16 + 3 +
                               *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0'
                     ) goto LAB_00170c89;
                  piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar16 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar16 + 2 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_)
                      == '\0') goto LAB_0017107e;
LAB_00174822:
                  uVar27 = uVar38 & 0xffffffff;
                  lVar16 = (long)plVar34 + -2;
                  uVar38 = (ulong)(int)uVar38;
                  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + uVar38 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)((uVar38 - 1) + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_
                               ) == '\0') {
                    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + uVar38 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ +
                                      uVar38 * 4);
                    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
                    *piVar18 = *piVar18 + 1;
                    uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ *
                                                            (long)plVar34 + local_338._24_8_ + -8 +
                                                           uVar38 * 4));
                    lVar16 = *local_288 * (long)plVar34 + local_2c0;
                  }
                  else {
LAB_0016df8f:
                    piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
                    *piVar18 = *piVar18 + 1;
                    lVar16 = *local_288 * (long)plVar34 + local_2c0;
                    uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ +
                                       local_338._24_8_ + uVar38 * 4);
                  }
                  piVar18 = (int *)(lVar16 + uVar38 * 4);
                  *piVar18 = *piVar18 + 1;
                  lVar16 = *(long *)local_338._80_8_;
                } while( true );
              }
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                                uVar38 * 4);
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              lVar16 = *(long *)local_338._80_8_;
              uVar27 = uVar27 & 0xffffffff;
              plVar19 = local_268;
              goto LAB_0016f0bc;
            }
            piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + -8 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                               -8 + uVar38 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                    local_338._24_8_ + -8 + uVar38 * 4));
            goto LAB_00173b63;
          }
          uVar38 = (ulong)iVar11;
          piVar18 = (int *)(lVar33 + 8 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar38 + 2 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0')
          {
            uVar38 = (ulong)iVar11;
            piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)((uVar38 - 1) + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                '\0') goto LAB_0016f5c9;
            piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + -8 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                               -8 + uVar38 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                    local_338._24_8_ + -8 + uVar38 * 4));
            goto LAB_00173f75;
          }
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar38 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar38 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0') {
            lVar16 = (long)plVar34 + -2;
            piVar18 = (int *)(local_1e8 + *local_1b0 * lVar16 + 4 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) ==
                '\0') {
              piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + uVar38 * 4)
              ;
              piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              local_168 = uVar27;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar16 * *(long *)local_338._80_8_ +
                                                      local_338._24_8_ + 8 + uVar38 * 4));
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                                uVar38 * 4);
            }
            else {
              piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                                uVar38 * 4);
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                                uVar38 * 4);
              local_168 = uVar27;
            }
            uVar10 = TTA::MemMerge(uVar10,uVar12);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
            uVar27 = local_168;
            goto LAB_00171e9a;
          }
          lVar35 = (long)iVar11;
          piVar18 = (int *)(local_1e8 + *local_1b0 * lVar16 + -4 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          lVar33 = (long)plVar34 + -2;
          if (*(char *)(lVar35 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0'
             ) {
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                              uVar38 * 4);
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                    local_338._24_8_ + -8 + lVar35 * 4));
          }
          else {
            piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) !=
                '\0') {
              piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(uVar38 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
              {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 +
                                  lVar35 * 4);
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
                *piVar18 = *piVar18 + 1;
                local_168 = uVar27;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar33 * *(long *)local_338._80_8_ +
                                                        local_338._24_8_ + 8 + uVar38 * 4));
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8
                                  + lVar35 * 4);
              }
              else {
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                                  uVar38 * 4);
                piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8
                                  + lVar35 * 4);
                local_168 = uVar27;
              }
              uVar10 = TTA::MemMerge(uVar10,uVar12);
              piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
              uVar27 = local_168;
              goto LAB_00171e9a;
            }
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 +
                              lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar33 * *(long *)local_338._80_8_ +
                                                    local_338._24_8_ + 8 + uVar38 * 4));
            piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                                    local_338._24_8_ + -8 + lVar35 * 4));
            plVar19 = local_268;
          }
          piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
          goto LAB_00171e9a;
        }
LAB_00175a15:
        piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + (long)(int)uVar27 * 4)
        ;
        *piVar18 = *piVar18 + 1;
        if (*(char *)((long)(int)uVar27 + 1 +
                     ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
        goto LAB_00175a56;
        goto LAB_001739d6;
      }
      goto LAB_0016e0b8;
    }
LAB_001738cd:
    uVar38 = (ulong)(int)uVar27;
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 1 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_)
        != '\0') goto LAB_00173910;
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0'
       ) goto LAB_001739d6;
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                      uVar38 * 4);
LAB_00173b63:
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
    goto LAB_00173b76;
  }
  lVar35 = (long)plVar34 + -2;
  piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + 0xc + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  lVar31 = *local_1b0 * lVar33 + local_1e8;
  if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * lVar35 + local_260._24_8_) == '\0') {
    piVar18 = (int *)(lVar31 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
    goto LAB_001717c5;
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
      piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + 8 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar35 + local_338._24_8_ + 8 + lVar16 * 4);
      piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + 0x10 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar35 * *(long *)local_338._80_8_ + local_338._24_8_
                                              + 0x10 + lVar16 * 4));
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
      goto LAB_0017182a;
    }
LAB_00174a40:
    lVar16 = (long)plVar34 + -2;
    iVar11 = (int)uVar27;
    lVar33 = (long)iVar11;
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar33 + -1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0') {
      lVar33 = (long)iVar11;
      piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + lVar33 * 4);
      piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_
                                              + 8 + lVar33 * 4));
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        lVar33 * 4);
    }
    else {
      piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar33 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        lVar33 * 4);
    }
    uVar10 = TTA::MemMerge(uVar10,uVar12);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + (long)iVar11 * 4);
    uVar38 = (long)iVar11;
LAB_00174bca:
    uVar27 = uVar27 & 0xffffffff;
    plVar19 = local_268;
    goto LAB_00171e9a;
  }
  piVar18 = (int *)(lVar31 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + lVar33 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
  goto LAB_001717c5;
LAB_00174513:
  uVar27 = uVar38 & 0xffffffff;
  uVar38 = (ulong)(int)uVar38;
  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)((uVar38 - 1) + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_)
      != '\0') goto LAB_00173a5f;
LAB_00174559:
  piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                    uVar38 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 + uVar38 * 4)
  ;
  goto LAB_001745c6;
LAB_0016e13b:
  lVar16 = (long)plVar34 + -1;
  uVar38 = (ulong)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  cVar1 = *(char *)(uVar38 + 2 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_);
  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  cVar2 = *(char *)(uVar38 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_);
  if (cVar1 != '\0') {
    if (cVar2 != '\0') goto LAB_0016e1bd;
    goto LAB_00171dfe;
  }
  if (cVar2 != '\0') goto LAB_0016e27f;
  uVar10 = TTA::MemNewLabel();
  lVar16 = *local_288 * (long)plVar34 + local_2c0;
LAB_0016e61f:
  piVar18 = (int *)(lVar16 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  lVar16 = *(long *)local_338._80_8_;
  plVar37 = plVar19;
  goto LAB_001713a6;
LAB_0016ebfc:
  lVar16 = (long)plVar34 + -1;
  iVar11 = (int)uVar27;
  uVar20 = (ulong)iVar11;
  lVar33 = *local_1b0;
  lVar31 = lVar33 * lVar16 + local_1e8;
  piVar18 = (int *)(lVar31 + 4 + uVar20 * 4);
  *piVar18 = *piVar18 + 1;
  lVar35 = *(long *)local_260._80_8_;
  lVar41 = lVar35 * lVar16 + local_260._24_8_;
  plVar19 = local_268;
  if (*(char *)(uVar20 + 1 + lVar41) != '\0') {
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    uVar38 = uVar27;
    if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0') {
      piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + (long)iVar11 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)((long)iVar11 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) !=
          '\0') goto LAB_00175c3d;
      piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                        uVar20 * 4);
    }
    else {
      piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                        uVar20 * 4);
    }
    goto LAB_00174ef0;
  }
  piVar18 = (int *)(lVar33 * (long)plVar34 + local_1e8 + 4 + uVar20 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(uVar20 + 1 + local_260._24_8_ + lVar35 * (long)plVar34) == '\0') {
    uVar38 = (ulong)iVar11;
    piVar18 = (int *)(lVar31 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar41 + uVar38) != '\0') {
      lVar33 = *local_288;
      piVar18 = (int *)(lVar33 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      lVar16 = *(long *)local_338._80_8_;
      uVar10 = *(uint *)(((long)plVar34 + -2) * lVar16 + local_338._24_8_ + uVar38 * 4);
      piVar18 = (int *)(lVar33 * (long)plVar34 + local_2c0 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      goto LAB_00170820;
    }
    lVar33 = (long)iVar11;
    piVar18 = (int *)(lVar31 + -4 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar41 + -1 + lVar33) == '\0') {
      uVar10 = TTA::MemNewLabel();
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      lVar16 = *(long *)local_338._80_8_;
      plVar19 = local_268;
      goto LAB_0016f0bc;
    }
    lVar35 = *local_288;
    piVar18 = (int *)(lVar35 * ((long)plVar34 + -2) + local_2c0 + -8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *(long *)local_338._80_8_;
    uVar10 = *(uint *)(((long)plVar34 + -2) * lVar16 + local_338._24_8_ + -8 + lVar33 * 4);
    piVar18 = (int *)(lVar35 * (long)plVar34 + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    goto LAB_0016f0bc;
  }
  uVar38 = (ulong)iVar11;
  piVar18 = (int *)(lVar31 + 8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar41 + 2 + uVar38) != '\0') {
    piVar18 = (int *)(local_1e8 + *local_1b0 * lVar16 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0')
    goto LAB_0016e1bd;
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + -4 + (long)iVar11 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)((long)iVar11 + -1 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0'
       ) goto LAB_00176294;
    piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                      uVar38 * 4);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
    goto LAB_00171e9a;
  }
  uVar38 = (ulong)iVar11;
  piVar18 = (int *)(lVar31 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  plVar37 = local_268;
  if (*(char *)(lVar41 + uVar38) != '\0') {
    lVar33 = *local_288;
    piVar18 = (int *)(lVar33 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *(long *)local_338._80_8_;
    uVar10 = *(uint *)(((long)plVar34 + -2) * lVar16 + local_338._24_8_ + uVar38 * 4);
    piVar18 = (int *)(lVar33 * (long)plVar34 + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    goto LAB_0016e2da;
  }
  lVar33 = (long)iVar11;
  piVar18 = (int *)(lVar31 + -4 + lVar33 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar41 + -1 + lVar33) == '\0') {
    uVar10 = TTA::MemNewLabel();
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *(long *)local_338._80_8_;
    plVar37 = local_268;
  }
  else {
    lVar35 = *local_288;
    piVar18 = (int *)(lVar35 * ((long)plVar34 + -2) + local_2c0 + -8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *(long *)local_338._80_8_;
    uVar10 = *(uint *)(((long)plVar34 + -2) * lVar16 + local_338._24_8_ + -8 + lVar33 * 4);
    piVar18 = (int *)(lVar35 * (long)plVar34 + local_2c0 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
  }
  goto LAB_001713a6;
LAB_0016e1bd:
  lVar16 = (long)plVar34 + -2;
  uVar38 = (ulong)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0')
  goto code_r0x0016e203;
LAB_00171dfe:
  piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                    uVar38 * 4);
  lVar16 = *local_288;
  goto LAB_00171e8a;
code_r0x0016e203:
  uVar38 = (ulong)(int)uVar27;
  piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + uVar38 * 4);
  piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar12 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + uVar38 * 4);
  goto LAB_001745c6;
LAB_00176294:
  plVar19 = local_268;
  lVar16 = (long)plVar34 + -2;
  iVar11 = (int)uVar27;
  lVar33 = (long)iVar11;
  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 4 + lVar33 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar33 + 1 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0') {
    lVar33 = (long)iVar11;
    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + -8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + -8 + lVar33 * 4);
    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    uVar12 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar33 * 4);
  }
  else {
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar33 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) != '\0') {
      piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar33 * 4);
      lVar16 = *local_288;
      goto LAB_001764c7;
    }
    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + -8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar16 + local_338._24_8_ + -8 + lVar33 * 4);
    piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + 8 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    uVar12 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar33 * 4);
  }
  uVar10 = TTA::MemMerge(uVar10,uVar12);
  lVar16 = *local_288;
LAB_001764c7:
  uVar38 = (ulong)iVar11;
  piVar18 = (int *)(lVar16 * (long)plVar34 + local_2c0 + uVar38 * 4);
  goto LAB_00171e9a;
LAB_001740cc:
  uVar27 = uVar38 & 0xffffffff;
  uVar38 = (ulong)(int)uVar38;
  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + -4 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)((uVar38 - 1) + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_)
      != '\0') {
LAB_00175a56:
    uVar38 = (ulong)(int)uVar27;
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
        '\0') goto LAB_00171af5;
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    cVar1 = *(char *)(uVar38 + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_);
joined_r0x00173488:
    if (cVar1 != '\0') goto LAB_00171af5;
  }
LAB_0016f3fe:
  piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                    uVar38 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                          local_338._24_8_ + -8 + uVar38 * 4));
  plVar25 = local_270;
  goto LAB_00171b25;
LAB_0017107e:
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + 8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  lVar16 = *(long *)local_338._80_8_;
  uVar27 = uVar38 & 0xffffffff;
LAB_0016f0bc:
  *(uint *)(lVar16 * (long)plVar34 + local_338._24_8_ + uVar38 * 4) = uVar10;
  lVar16 = (long)(int)uVar27;
  uVar27 = lVar16 + 2;
  if ((int)local_198 <= (int)uVar27) {
    piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    cVar1 = *(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_);
    if ((int)uVar27 <= (int)local_198) {
      if (cVar1 != '\0') goto LAB_00170113;
      goto LAB_00170094;
    }
    uVar38 = uVar27;
    if (cVar1 == '\0') goto LAB_00174281;
    piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar16 + 1 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
        != '\0') goto LAB_0017019a;
    goto LAB_0016de7d;
  }
  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 2 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) == '\0')
  goto LAB_0016f2b4;
  piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + 4 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 1 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
      '\0') {
LAB_00170ac3:
    uVar27 = uVar27 & 0xffffffff;
    goto LAB_0016ddea;
  }
  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 0xc + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 3 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
      '\0') {
    piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 8 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 +
                      lVar16 * 4);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                            local_338._24_8_ + lVar16 * 4));
    uVar38 = uVar27 & 0xffffffff;
    uVar20 = uVar27;
    goto LAB_00174ef0;
  }
  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 0xc + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 3 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0')
  goto LAB_0016f499;
  goto LAB_00170728;
LAB_0016f2b4:
  uVar27 = uVar27 & 0xffffffff;
LAB_0016f2fb:
  uVar20 = (ulong)plVar34 | 1;
  lVar16 = (long)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + *(long *)local_260._80_8_ * uVar20 + local_260._24_8_) == '\0')
  goto LAB_0016e0b8;
  piVar18 = (int *)(*local_1b0 * (long)plVar34 + local_1e8 + 4 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + 1 + *(long *)local_260._80_8_ * (long)plVar34 + local_260._24_8_) != '\0')
  goto code_r0x0016f37d;
LAB_0016f875:
  lVar35 = (long)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * ((ulong)plVar34 | 1) + local_1e8 + -4 + lVar35 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar35 + -1 + ((ulong)plVar34 | 1) * *(long *)local_260._80_8_ + local_260._24_8_)
      == '\0') {
LAB_0016f901:
    uVar10 = TTA::MemNewLabel();
    lVar16 = *local_288 * (long)plVar34 + local_2c0;
  }
  else {
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + lVar35 * 4);
    *piVar18 = *piVar18 + 1;
    lVar16 = *local_288 * (long)plVar34 + local_2c0;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                      lVar35 * 4);
  }
  piVar18 = (int *)(lVar16 + lVar35 * 4);
  *piVar18 = *piVar18 + 1;
  *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar35 * 4) = uVar10;
  goto LAB_0016f951;
code_r0x0016f37d:
  piVar18 = (int *)(*local_1b0 * uVar20 + local_1e8 + -4 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar16 + -1 + uVar20 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0')
  goto LAB_0016e0f8;
LAB_0016f3b7:
  uVar38 = (ulong)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 4 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(uVar38 + 1 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
      '\0') {
LAB_0016f499:
    lVar16 = (long)plVar34 + -1;
    uVar38 = (ulong)(int)uVar27;
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 8 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 2 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0') {
      uVar27 = uVar27 & 0xffffffff;
      plVar19 = local_268;
LAB_0016f5c9:
      uVar38 = (ulong)(int)uVar27;
      piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      if (*(char *)(uVar38 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
          '\0') goto LAB_0016f60e;
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      lVar16 = *local_288 * (long)plVar34 + local_2c0;
      uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        uVar38 * 4);
      goto LAB_0016e61f;
    }
    lVar33 = (long)plVar34 + -2;
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
      piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + uVar38 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * (long)plVar34 +
                                              local_338._24_8_ + -8 + uVar38 * 4));
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
      uVar27 = uVar27 & 0xffffffff;
      plVar19 = local_268;
      goto LAB_00171e9a;
    }
    uVar20 = (ulong)(int)uVar27;
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar20 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
      piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + uVar38 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        uVar20 * 4);
    }
    else {
      piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4);
      piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = TTA::MemMerge(uVar10,*(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_
                                              + 8 + uVar38 * 4));
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar20 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        uVar20 * 4);
    }
    uVar10 = TTA::MemMerge(uVar12,uVar10);
    piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar20 * 4);
    uVar38 = uVar20;
    goto LAB_00174bca;
  }
  goto LAB_0016f3fe;
LAB_001739d6:
  uVar38 = (ulong)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + 8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(uVar38 + 2 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) !=
      '\0') {
LAB_00173a19:
    uVar38 = (ulong)(int)uVar27;
    piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -2) + local_1e8 + 4 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * ((long)plVar34 + -2) + local_260._24_8_)
        == '\0') goto LAB_00174559;
    goto LAB_00173a5f;
  }
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 + uVar38 * 4)
  ;
LAB_00173f75:
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
  local_168 = uVar27;
  plVar37 = plVar19;
  goto LAB_0017290d;
LAB_001719c0:
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
  uVar27 = uVar38 & 0xffffffff;
  goto LAB_00173b76;
LAB_00171a16:
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
  local_168 = uVar38 & 0xffffffff;
  goto LAB_0017290d;
LAB_001717c5:
  piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + 0x10 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ + 0x10 +
                    lVar16 * 4);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + lVar16 * 4);
  *piVar18 = *piVar18 + 1;
  uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + lVar16 * 4);
  plVar19 = plVar37;
LAB_0017182a:
  uVar10 = TTA::MemMerge(uVar10,uVar12);
  piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + uVar38 * 4);
  uVar27 = uVar38 & 0xffffffff;
  goto LAB_00171e9a;
LAB_00173a5f:
  uVar38 = (ulong)(int)uVar27;
  piVar18 = (int *)(*local_1b0 * ((long)plVar34 + -1) + local_1e8 + uVar38 * 4);
  *piVar18 = *piVar18 + 1;
  lVar16 = (long)plVar34 + -2;
  if (*(char *)(uVar38 + ((long)plVar34 + -1) * *(long *)local_260._80_8_ + local_260._24_8_) ==
      '\0') {
    piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + uVar38 * 4);
    *piVar18 = *piVar18 + 1;
    lVar33 = (long)((int)uVar27 + 2);
    if (*(char *)(uVar38 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0') {
      piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar33 * 4);
      *piVar18 = *piVar18 + 1;
      uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar33 * 4);
      piVar18 = (int *)(*local_288 * (long)plVar34 + local_2c0 + -8 + uVar38 * 4);
      *piVar18 = *piVar18 + 1;
      uVar12 = *(uint *)(*(long *)local_338._80_8_ * (long)plVar34 + local_338._24_8_ + -8 +
                        uVar38 * 4);
      goto LAB_001745c6;
    }
LAB_00173ae8:
    piVar18 = (int *)(*local_288 * ((long)plVar34 + -2) + local_2c0 + lVar33 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(((long)plVar34 + -2) * *(long *)local_338._80_8_ + local_338._24_8_ +
                      lVar33 * 4);
    lVar16 = *local_288;
    goto LAB_00171e8a;
  }
  goto LAB_00171dfe;
code_r0x00177b37:
  piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + lVar31 + 0x10 + lVar35 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar35 + 4 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_ + lVar41)
      == '\0') {
    piVar18 = (int *)(lVar36 + *local_288 * lVar33 + local_2c0);
    *piVar18 = *piVar18 + 1;
    uVar27 = (ulong)(uint)(iVar11 + iVar9);
    puVar14 = (undefined4 *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar36);
    uVar20 = lVar41 + lVar35 + 2;
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar41 * 4 + lVar32);
    goto LAB_00177f93;
  }
  piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + lVar31 + 0xc + lVar35 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_ + lVar41) == '\0'
     ) {
    piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar31 + 0x10 + lVar35 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar31 + 0x10 +
                      lVar35 * 4);
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar31 + lVar35 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ +
                                            lVar31 + lVar35 * 4));
    plVar25 = local_270;
  }
  else {
    piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar31 + 0x10 + lVar35 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar31 + 0x10 +
                      lVar35 * 4);
  }
  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar31 + 8 + lVar35 * 4);
  *piVar18 = *piVar18 + 1;
  *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar31 + 8 + lVar35 * 4) =
       uVar10;
  lVar24 = lVar24 + 0x200000000;
  lVar36 = lVar41 + lVar35;
  lVar35 = lVar35 + 2;
  lVar32 = lVar32 + 8;
  if (lVar16 <= lVar36 + 4) {
    uVar10 = iVar13 + (int)lVar35 + 2;
    iVar13 = iVar13 + (int)lVar35;
    pSVar26 = local_188;
    goto LAB_001795b4;
  }
  goto LAB_00177a6b;
code_r0x00177d84:
  piVar18 = (int *)(*local_288 * (long)local_140 + local_2c0 + lVar41 * 4 + lVar32);
  plVar19 = local_140;
  while( true ) {
    *piVar18 = *piVar18 + 1;
    uVar17 = *(undefined4 *)
              ((long)plVar19 * *(long *)local_338._80_8_ + local_338._24_8_ + uVar20 * 4);
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) = uVar17;
    lVar35 = (long)iVar11;
    uVar10 = iVar11 + 2;
    uVar27 = (ulong)uVar10;
    if ((int)local_198 <= (int)uVar10) break;
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0')
    goto LAB_00178ad8;
LAB_00176ab7:
    iVar11 = (int)uVar27;
    uVar20 = (ulong)iVar11;
    piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0') {
      while( true ) {
        uVar20 = (ulong)iVar11;
        piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
LAB_00177046:
        *piVar18 = *piVar18 + 1;
        *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) = 0;
        lVar35 = (long)iVar11;
        uVar20 = lVar35 + 2;
        iVar11 = (int)uVar20;
        if ((int)local_198 <= iVar11) break;
        piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0') {
          uVar27 = uVar20 & 0xffffffff;
          goto LAB_00176ab7;
        }
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0xc + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) !=
            '\0') {
          piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar25 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if ((*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
               == '\0') &&
             (piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + lVar35 * 4),
             *piVar18 = *piVar18 + 1,
             *(char *)(lVar35 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) !=
             '\0')) {
            uVar27 = uVar20 & 0xffffffff;
            goto LAB_00178f25;
          }
          piVar18 = (int *)(*local_288 * (long)local_268 + local_2c0 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_268 + local_338._24_8_ + 8 +
                            lVar35 * 4);
          goto LAB_00177171;
        }
        piVar18 = (int *)(local_1e8 + *local_1b0 * lVar33 + 0xc + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0') {
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              != '\0') {
            piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + 8 +
                              lVar35 * 4);
            goto LAB_001772fb;
          }
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              != '\0') {
            piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            lVar31 = *(long *)local_338._80_8_ * lVar39;
            goto LAB_00176f30;
          }
          uVar10 = TTA::MemNewLabel();
          plVar25 = local_270;
          goto LAB_001772fb;
        }
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0x10 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        cVar1 = *(char *)(lVar35 + 4 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
        ;
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        cVar2 = *(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
        ;
        if (cVar1 != '\0') {
          if (cVar2 != '\0') {
            uVar27 = uVar20 & 0xffffffff;
            goto LAB_00178df2;
          }
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              == '\0') {
            piVar18 = (int *)(*local_288 * (long)local_268 + local_2c0 + 0x10 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_268 + local_338._24_8_ + 0x10
                              + lVar35 * 4);
            goto LAB_00176fcd;
          }
          uVar27 = uVar20 & 0xffffffff;
LAB_00179306:
          uVar20 = (ulong)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 4 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) == '\0')
          {
            lVar36 = *local_288;
          }
          else {
            piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) != '\0') {
LAB_00177987:
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + uVar20 * 4);
              *piVar18 = *piVar18 + 1;
              lVar36 = *(long *)local_338._80_8_ * lVar39;
              goto LAB_001779fc;
            }
            lVar36 = *local_288;
          }
          uVar20 = (ulong)(int)uVar27;
          piVar18 = (int *)(lVar36 * lVar39 + local_2c0 + -8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + -8 + uVar20 * 4
                            );
          piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          lVar36 = *(long *)local_338._80_8_ * lVar39;
          goto LAB_00178ecf;
        }
        if (cVar2 != '\0') goto LAB_00176c0b;
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) ==
            '\0') {
          uVar10 = TTA::MemNewLabel();
          plVar25 = local_270;
        }
        else {
          piVar18 = (int *)(*local_288 * (long)local_268 + local_2c0 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_268 + local_338._24_8_ +
                            lVar35 * 4);
        }
        piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
LAB_00177505:
        *piVar18 = *piVar18 + 1;
        *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) = uVar10;
        lVar35 = (long)iVar11;
        uVar20 = lVar35 + 2;
        iVar11 = (int)uVar20;
        if ((int)local_198 <= iVar11) {
          if ((int)local_198 < iVar11) goto LAB_001795c7;
          piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
          goto LAB_00179dfa;
          piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + 0xc + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 3 +
                       (long)(iVar3 + -2) * *(long *)local_260._80_8_ + local_260._24_8_) == '\0') {
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)
                      (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4)
                 = uVar17;
          }
          else {
            piVar18 = (int *)(*local_288 * (long)(iVar3 + -3) + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)((long)(iVar3 + -3) * *(long *)local_338._80_8_ + local_338._24_8_ + 8
                              + lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                    local_338._24_8_ + lVar35 * 4));
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4) =
                 uVar10;
          }
          goto LAB_0017a54f;
        }
        piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0xc + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              != '\0') {
            piVar18 = (int *)(*local_288 * (long)local_268 + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_268 + local_338._24_8_ + 8 +
                              lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                    local_338._24_8_ + lVar35 * 4));
            uVar27 = uVar20 & 0xffffffff;
            goto LAB_0017888f;
          }
          piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 0xc + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
          {
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
            goto LAB_00179402;
          }
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0x10 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 4 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              != '\0') {
            piVar18 = (int *)(*local_288 * (long)local_268 + local_2c0 + 0x10 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_268 + local_338._24_8_ + 0x10
                              + lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                    local_338._24_8_ + lVar35 * 4));
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
            uVar27 = uVar20 & 0xffffffff;
            plVar25 = local_270;
            goto LAB_00177a19;
          }
          piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          puVar14 = (undefined4 *)
                    (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar35 * 4);
LAB_001777e9:
          piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
          uVar27 = uVar20 & 0xffffffff;
LAB_00177f93:
          while( true ) {
            lVar36 = local_178;
            pSVar26 = local_188;
            uVar17 = *puVar14;
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) =
                 uVar17;
            iVar11 = (int)uVar27;
            uVar10 = iVar11 + 2;
            local_168 = uVar27;
            if ((int)local_198 <= (int)uVar10) break;
            lVar30 = (long)iVar11;
            local_170 = lVar30 + 2;
            lVar41 = lVar30 << 0x20;
            lVar29 = local_2c0 + lVar30 * 4;
            lVar32 = lVar30 * 4 + local_338._24_8_;
            lVar31 = local_1e8 + lVar30 * 4;
            local_190 = local_1e8 + *local_1b0 * lVar33 + lVar30 * 4 + 8;
            local_180 = (long *)(local_260._24_8_ + *(long *)local_260._80_8_ * lVar33 + lVar30 + 2)
            ;
            lVar24 = local_260._24_8_ + lVar30;
            lVar40 = 8;
            lVar35 = 0;
            while( true ) {
              piVar18 = (int *)(local_190 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              plVar25 = local_270;
              if (*(char *)((long)local_180 + lVar35) == '\0') {
                uVar27 = (ulong)(uint)((int)local_170 + (int)lVar35);
                goto LAB_00177804;
              }
              piVar18 = (int *)(*local_1b0 * (long)local_270 + lVar31 + 0xc + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              lVar15 = lVar41 >> 0x1e;
              lVar23 = lVar41 >> 0x20;
              if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * (long)local_270 + lVar24) !=
                  '\0') break;
              piVar18 = (int *)(*local_1b0 * lVar33 + lVar31 + 0xc + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * lVar33 + lVar24) == '\0') {
                piVar18 = (int *)(lVar15 + *local_288 * lVar33 + local_2c0);
                *piVar18 = *piVar18 + 1;
                iVar11 = (int)local_170 + (int)lVar35;
                uVar10 = *(uint *)(lVar15 + *(long *)local_338._80_8_ * lVar33 + local_338._24_8_);
                lVar35 = lVar30 + lVar35;
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar30 * 4 + lVar40);
                goto LAB_00178359;
              }
              piVar18 = (int *)(*local_1b0 * (long)local_270 + lVar31 + 0x10 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar35 + 4 + *(long *)local_260._80_8_ * (long)local_270 + lVar24) !=
                  '\0') {
                uVar38 = local_170 + lVar35;
                piVar18 = (int *)(*local_1b0 * local_130 + local_1e8 + lVar30 * 4 + 0xc + lVar35 * 4
                                 );
                *piVar18 = *piVar18 + 1;
                uVar20 = lVar30 + 2 + lVar35;
                if (*(char *)(lVar30 + lVar35 + 3 +
                             *(long *)local_260._80_8_ * local_130 + local_260._24_8_) == '\0') {
                  piVar18 = (int *)(*local_288 * local_130 + local_2c0 + lVar30 * 4 + 0x10 +
                                   lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * local_130 + local_338._24_8_ +
                                     lVar30 * 4 + 0x10 + lVar35 * 4);
                  piVar18 = (int *)(lVar15 + *local_288 * lVar33 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar15 + *(long *)local_338._80_8_ *
                                                                   lVar33 + local_338._24_8_));
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar30 * 4 + lVar40);
                  uVar27 = uVar38 & 0xffffffff;
                  pSVar26 = local_188;
                  plVar25 = local_270;
                  goto LAB_00177a19;
                }
                piVar18 = (int *)(*local_1b0 * local_130 + local_1e8 + lVar30 * 4 + 8 + lVar35 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar35 + 2 +
                             *(long *)local_260._80_8_ * local_130 + local_260._24_8_ + lVar30) ==
                    '\0') {
                  piVar18 = (int *)(*local_288 * local_130 + local_2c0 + lVar30 * 4 + 0x10 +
                                   lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * local_130 + local_338._24_8_ +
                                     lVar30 * 4 + 0x10 + lVar35 * 4);
                  piVar18 = (int *)(lVar15 + *local_288 * lVar33 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar15 + *(long *)local_338._80_8_ *
                                                                   lVar33 + local_338._24_8_));
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar30 * 4 + lVar40);
                  uVar27 = uVar38 & 0xffffffff;
                  plVar25 = local_270;
                }
                else {
                  piVar18 = (int *)(lVar15 + *local_1b0 * (long)local_270 + local_1e8);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar23 + *(long *)local_260._80_8_ * (long)local_270 +
                                         local_260._24_8_) != '\0') goto LAB_00178472;
                  piVar18 = (int *)(*local_288 * local_130 + local_2c0 + lVar30 * 4 + 0x10 +
                                   lVar35 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * local_130 + local_338._24_8_ +
                                     lVar30 * 4 + 0x10 + lVar35 * 4);
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar23 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                          local_338._24_8_ + lVar23 * 4));
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar30 * 4 + lVar40);
                  uVar27 = uVar38 & 0xffffffff;
                  plVar25 = local_270;
                }
                goto LAB_00177a19;
              }
              piVar18 = (int *)(*local_288 * lVar33 + lVar29 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar17 = *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + lVar32 + lVar35 * 4);
              piVar18 = (int *)(*local_288 * lVar33 + lVar29 + 8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + lVar32 + 8 + lVar35 * 4) = uVar17
              ;
              lVar41 = lVar41 + 0x200000000;
              lVar15 = lVar35 + lVar30;
              lVar35 = lVar35 + 2;
              lVar40 = lVar40 + 8;
              if (lVar16 <= lVar15 + 4) {
                uVar10 = iVar11 + (int)lVar35 + 2;
                uVar27 = (ulong)(uint)(iVar11 + (int)lVar35);
                goto LAB_0017957d;
              }
            }
            uVar27 = local_170 + lVar35;
            piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + lVar30 * 4 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar20 = lVar30 + 2 + lVar35;
            if (*(char *)(lVar30 + lVar35 + 2 +
                         *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) == '\0') {
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar30 * 4 + 8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar30 * 4
                                 + 8 + lVar35 * 4);
              piVar18 = (int *)(lVar15 + *local_288 * lVar33 + local_2c0);
              *piVar18 = *piVar18 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(lVar15 + *(long *)local_338._80_8_ * lVar33 +
                                                               local_338._24_8_));
              uVar27 = uVar27 & 0xffffffff;
              pSVar26 = local_188;
              lVar36 = local_178;
            }
            else {
              piVar18 = (int *)(lVar15 + *local_1b0 * (long)local_270 + local_1e8);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar23 + *(long *)local_260._80_8_ * (long)local_270 + local_260._24_8_)
                  != '\0') goto LAB_00178273;
              piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + lVar30 * 4 + 8 + lVar35 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + lVar30 * 4
                                 + 8 + lVar35 * 4);
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar23 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                      local_338._24_8_ + lVar23 * 4));
              uVar27 = uVar27 & 0xffffffff;
            }
LAB_0017888f:
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4) = uVar10;
            iVar11 = (int)uVar27;
            uVar10 = iVar11 + 2;
            if ((int)local_198 <= (int)uVar10) {
LAB_0017967b:
              uVar20 = (ulong)uVar10;
              lVar39 = (long)(int)uVar10;
              piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              cVar1 = *(char *)(lVar39 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_);
              iVar11 = (int)uVar27;
              if ((int)local_198 < (int)uVar10) {
                if (cVar1 == '\0') goto LAB_00179a9e;
                lVar36 = (long)iVar11;
                piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + lVar36 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar36 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) !=
                    '\0') goto LAB_00179a11;
              }
              else {
                if (cVar1 == '\0') goto LAB_0017a34c;
                lVar36 = (long)iVar11;
                piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + lVar36 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar36 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) !=
                    '\0') goto LAB_001798a8;
                lVar16 = (long)(iVar3 + -2);
                piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 0xc + lVar36 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar36 + 3 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) !=
                    '\0') {
                  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  if (*(char *)(lVar39 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) ==
                      '\0') goto LAB_0017a2a3;
                  goto LAB_0017a07a;
                }
              }
              piVar18 = (int *)(*local_1b0 * (long)(iVar3 + -2) + local_1e8 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              lVar36 = (long)(iVar3 + -3);
              lVar16 = *local_288 * lVar36 + local_2c0;
              if (*(char *)(lVar39 + (long)(iVar3 + -2) * *(long *)local_260._80_8_ +
                                     local_260._24_8_) != '\0') goto LAB_0017a0f4;
              piVar18 = (int *)(lVar16 + (long)iVar11 * 4);
              *piVar18 = *piVar18 + 1;
              lVar16 = *local_288 * lVar33 + local_2c0;
              uVar17 = *(undefined4 *)
                        (lVar36 * *(long *)local_338._80_8_ + local_338._24_8_ + (long)iVar11 * 4);
              goto LAB_0017a122;
            }
            lVar41 = *(long *)local_260._80_8_;
            local_180 = (long *)(long)iVar11;
            local_170 = (long)local_180 + 2;
            lVar24 = (long)local_180 << 0x20;
            lVar35 = local_1e8 + (long)local_180 * 4;
            local_190 = local_1e8 + *local_1b0 * lVar33 + (long)local_180 * 4 + 8;
            lVar31 = local_338._24_8_ + 8 + (long)local_180 * 4;
            lVar32 = local_2c0 + (long)local_180 * 4 + 8;
            lVar29 = 8;
            lVar30 = 0;
LAB_00178981:
            piVar18 = (int *)(local_190 + lVar30 * 4);
            *piVar18 = *piVar18 + 1;
            iVar13 = (int)lVar30;
            iVar9 = (int)local_170;
            pSVar26 = local_188;
            plVar25 = local_270;
            local_168 = uVar27;
            if (*(char *)((long)local_180 + lVar30 + local_260._24_8_ + lVar41 * lVar33 + 2) == '\0'
               ) {
              uVar27 = (ulong)(uint)(iVar9 + iVar13);
              goto LAB_00176ab7;
            }
            piVar18 = (int *)(*local_1b0 * lVar33 + lVar35 + 4 + lVar30 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)((long)local_180 +
                         lVar30 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0'
               ) {
              piVar18 = (int *)(*local_1b0 * lVar36 + lVar35 + 0xc + lVar30 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((long)local_180 +
                           lVar30 + 3 + *(long *)local_260._80_8_ * lVar36 + local_260._24_8_) ==
                  '\0') {
                piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + (long)local_180 * 4 + 0xc +
                                 lVar30 * 4);
                *piVar18 = *piVar18 + 1;
                uVar27 = local_170 + lVar30;
                iVar11 = (int)uVar27;
                uVar20 = (long)local_180 + lVar30 + 2;
                lVar31 = *local_1b0 * lVar36 + local_1e8;
                lVar35 = lVar24 >> 0x1e;
                if (*(char *)((long)local_180 +
                             *(long *)local_260._80_8_ * lVar33 + local_260._24_8_ + lVar30 + 3) !=
                    '\0') {
                  piVar18 = (int *)(lVar31 + (lVar24 + 0x400000000 >> 0x1e));
                  *piVar18 = *piVar18 + 1;
                  cVar1 = *(char *)((lVar24 + 0x400000000 >> 0x20) +
                                   *(long *)local_260._80_8_ * lVar36 + local_260._24_8_);
                  piVar18 = (int *)(*local_1b0 * lVar36 + local_1e8 + (long)local_180 * 4 + 8 +
                                   lVar30 * 4);
                  *piVar18 = *piVar18 + 1;
                  cVar2 = *(char *)((long)local_180 +
                                   lVar30 + 2 +
                                   *(long *)local_260._80_8_ * lVar36 + local_260._24_8_);
                  if (cVar1 != '\0') {
                    if (cVar2 == '\0') goto LAB_00179306;
                    goto LAB_00178df2;
                  }
                  if (cVar2 != '\0') goto LAB_00176c0b;
                  piVar18 = (int *)(lVar35 + *local_288 * lVar39 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(lVar35 + *(long *)local_338._80_8_ * lVar39 + local_338._24_8_)
                  ;
                  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + (long)local_180 * 4 + lVar29);
                  goto LAB_00177505;
                }
                piVar18 = (int *)(lVar31 + (long)local_180 * 4 + 8 + lVar30 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)((long)local_180 +
                             lVar30 + 2 + *(long *)local_260._80_8_ * lVar36 + local_260._24_8_) ==
                    '\0') {
                  piVar18 = (int *)(lVar35 + *local_288 * lVar39 + local_2c0);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(lVar35 + *(long *)local_338._80_8_ * lVar39 + local_338._24_8_)
                  ;
                  lVar35 = *local_288 * lVar33 + local_2c0 + (long)local_180 * 4;
                }
                else {
                  piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + (long)local_180 * 4 + 8 +
                                   lVar30 * 4);
                  *piVar18 = *piVar18 + 1;
                  uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                     (long)local_180 * 4 + 8 + lVar30 * 4);
                  lVar35 = *local_288 * lVar33 + local_2c0 + (long)local_180 * 4;
                }
                piVar18 = (int *)(lVar35 + lVar29);
                goto LAB_00179402;
              }
              piVar18 = (int *)(*local_1b0 * lVar36 + lVar35 + 8 + lVar30 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)((long)local_180 +
                           lVar30 + 2 + *(long *)local_260._80_8_ * lVar36 + local_260._24_8_) !=
                  '\0') goto code_r0x00178a05;
              uVar27 = (ulong)(uint)(iVar9 + iVar13);
LAB_00178f25:
              uVar20 = (ulong)(int)uVar27;
              piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + uVar20 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(uVar20 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) == '\0')
              {
                lVar35 = *local_288 * lVar39 + local_2c0;
LAB_00179027:
                piVar18 = (int *)(lVar35 + -8 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + -8 +
                                  uVar20 * 4);
                piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar12 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ +
                                  uVar20 * 4);
LAB_00179228:
                uVar10 = TTA::MemMerge(uVar10,uVar12);
              }
              else {
LAB_00178f66:
                piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                lVar35 = *(long *)local_338._80_8_ * lVar39;
LAB_00179002:
                uVar10 = *(uint *)(lVar35 + local_338._24_8_ + uVar20 * 4);
              }
              goto LAB_0017888f;
            }
            uVar27 = (ulong)(uint)(iVar9 + iVar13);
LAB_00178ad8:
            iVar11 = (int)uVar27;
            uVar38 = (ulong)iVar11;
            piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                != '\0') {
              piVar18 = (int *)(local_1e8 + *local_1b0 * (long)plVar25 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar20 = uVar38;
              if (*(char *)(uVar38 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                  != '\0') {
                lVar35 = *local_288;
                plVar25 = local_128;
LAB_00178fe3:
                piVar18 = (int *)(lVar35 * (long)plVar25 + local_2c0 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                lVar35 = *(long *)local_338._80_8_ * (long)plVar25;
                goto LAB_00179002;
              }
              piVar18 = (int *)(*local_1b0 * (long)local_138 + local_1e8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(uVar38 + *(long *)local_260._80_8_ * (long)local_138 + local_260._24_8_)
                  != '\0') {
                lVar35 = *local_288;
                plVar25 = local_138;
                goto LAB_00178fe3;
              }
              piVar18 = (int *)(*local_288 * (long)local_138 + local_2c0 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * (long)local_138 + local_338._24_8_ +
                                uVar38 * 4);
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 +
                                uVar38 * 4);
              goto LAB_00179228;
            }
            piVar18 = (int *)(local_1e8 + *local_1b0 * lVar33 + 4 + uVar38 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) ==
                '\0') {
              uVar20 = (ulong)iVar11;
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + uVar20 * 4);
              *piVar18 = *piVar18 + 1;
              uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 +
                                uVar20 * 4);
              goto LAB_001790bd;
            }
            uVar20 = (ulong)iVar11;
            piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 8 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            if (*(char *)(uVar20 + 2 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                != '\0') {
              piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 4 + uVar38 * 4);
              *piVar18 = *piVar18 + 1;
              if ((*(char *)(uVar38 + 1 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) ==
                   '\0') ||
                 ((piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + uVar20 * 4),
                  *piVar18 = *piVar18 + 1,
                  *(char *)(uVar20 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
                  == '\0' &&
                  (piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + uVar20 * 4),
                  *piVar18 = *piVar18 + 1,
                  *(char *)(uVar20 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) == '\0')
                  ))) {
                piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + 8 +
                                  uVar20 * 4);
                piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(*(long *)local_338._80_8_ * lVar33 +
                                                        local_338._24_8_ + -8 + uVar20 * 4));
                plVar25 = local_270;
              }
              else {
                piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + uVar20 * 4);
                *piVar18 = *piVar18 + 1;
                uVar10 = *(uint *)(*(long *)local_338._80_8_ * lVar39 + local_338._24_8_ + 8 +
                                  uVar20 * 4);
              }
              piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
              goto LAB_00177a19;
            }
            uVar20 = (ulong)iVar11;
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + uVar20 * 4);
            *piVar18 = *piVar18 + 1;
            puVar14 = (undefined4 *)
                      (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + uVar20 * 4 + -8);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + uVar20 * 4);
          }
LAB_0017957d:
          uVar20 = (ulong)uVar10;
          if ((int)local_198 < (int)uVar10) goto LAB_001795c7;
          lVar39 = (long)(int)uVar10;
          piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar39 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
          goto LAB_00179dfa;
          lVar16 = (long)(iVar3 + -2);
          lVar36 = (long)(int)uVar27;
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + 0xc + lVar36 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar36 + 3 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_) == '\0')
          {
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar36 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)
                      (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar36 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) =
                 uVar17;
            goto LAB_0017a54f;
          }
          lVar35 = (long)(iVar3 + -3);
          piVar18 = (int *)(*local_1b0 * lVar35 + local_1e8 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          if ((*(char *)(lVar39 + *(long *)local_260._80_8_ * lVar35 + local_260._24_8_) != '\0') &&
             (piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar36 * 4),
             *piVar18 = *piVar18 + 1,
             *(char *)(lVar36 + lVar16 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0'))
          goto LAB_0017980e;
          piVar18 = (int *)(*local_288 * lVar35 + local_2c0 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          uVar10 = *(uint *)(lVar35 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4);
          piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar36 * 4);
          *piVar18 = *piVar18 + 1;
          uVar12 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + lVar36 * 4);
          goto LAB_0017acb5;
        }
        uVar27 = uVar20 & 0xffffffff;
LAB_00177804:
        iVar11 = (int)uVar27;
        uVar20 = (ulong)iVar11;
        piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 4 + uVar20 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) != '\0') {
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              != '\0') {
            lVar35 = *local_288;
            plVar19 = local_268;
            goto LAB_00177898;
          }
          uVar20 = (ulong)iVar11;
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 8 + uVar20 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(uVar20 + 2 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_)
              != '\0') goto LAB_00177987;
          uVar10 = TTA::MemNewLabel();
          lVar35 = *local_288 * lVar33 + local_2c0;
          uVar20 = (ulong)iVar11;
LAB_001779f3:
          piVar18 = (int *)(lVar35 + uVar20 * 4);
          plVar25 = local_270;
          goto LAB_00177505;
        }
      }
      piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      cVar1 = *(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_);
      if ((int)local_198 < iVar11) {
        if (cVar1 == '\0') {
          piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4) =
               0;
          goto LAB_0017a54f;
        }
LAB_0017aa48:
        lVar39 = (long)(iVar3 + -2);
        piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar39 + local_260._24_8_) == '\0') {
          piVar18 = (int *)(*local_1b0 * lVar39 + local_1e8 + 4 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 1 + lVar39 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
          {
            piVar18 = (int *)(*local_288 * (long)(iVar3 + -3) + local_2c0 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            lVar36 = (long)(iVar3 + -3) * *(long *)local_338._80_8_ + local_338._24_8_;
            lVar39 = *local_288;
            goto LAB_0017ad2b;
          }
          uVar10 = TTA::MemNewLabel();
          piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4) = uVar10
          ;
          goto LAB_0017a54f;
        }
      }
      else {
        if (cVar1 == '\0') {
LAB_0017a34c:
          uVar10 = (uint)uVar20;
          goto LAB_0017a34f;
        }
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 0xc + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 3 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) ==
            '\0') goto LAB_0017aa48;
        piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 8 + lVar35 * 4);
        *piVar18 = *piVar18 + 1;
        if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) ==
            '\0') {
          piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + lVar35 * 4);
          *piVar18 = *piVar18 + 1;
          if (*(char *)(lVar35 + 1 + (long)plVar25 * *(long *)local_260._80_8_ + local_260._24_8_)
              == '\0') {
            piVar18 = (int *)(*local_288 * lVar39 + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            uVar17 = *(undefined4 *)
                      (lVar39 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4);
            piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + 8 + lVar35 * 4);
            *piVar18 = *piVar18 + 1;
            *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4)
                 = uVar17;
            goto LAB_0017a54f;
          }
LAB_0017a2a3:
          lVar16 = (long)(iVar3 + -3);
          lVar39 = (long)(int)uVar20;
          piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar39 * 4);
          *piVar18 = *piVar18 + 1;
          cVar1 = *(char *)(lVar39 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_);
          goto joined_r0x0017a2e0;
        }
      }
      piVar18 = (int *)(*local_288 * (long)(iVar3 + -3) + local_2c0 + 8 + lVar35 * 4);
      *piVar18 = *piVar18 + 1;
      lVar39 = *local_288 * lVar33 + local_2c0;
      uVar17 = *(undefined4 *)
                ((long)(iVar3 + -3) * *(long *)local_338._80_8_ + local_338._24_8_ + 8 + lVar35 * 4)
      ;
      goto LAB_0017ad3b;
    }
    piVar18 = (int *)(*local_1b0 * (long)plVar25 + local_1e8 + 4 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(uVar20 + 1 + *(long *)local_260._80_8_ * (long)plVar25 + local_260._24_8_) == '\0'
       ) goto LAB_00176b4c;
    lVar35 = *local_288;
    plVar19 = local_150;
LAB_00177898:
    piVar18 = (int *)(lVar35 * (long)plVar19 + local_2c0 + uVar20 * 4);
  }
  if ((int)local_198 < (int)uVar10) {
    uVar20 = (ulong)uVar10;
    goto LAB_001795c7;
  }
  piVar18 = (int *)(*local_1b0 * lVar33 + local_1e8 + 8 + lVar35 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar35 + 2 + *(long *)local_260._80_8_ * lVar33 + local_260._24_8_) == '\0')
  goto LAB_0017a34f;
LAB_001798a8:
  lVar36 = (long)(iVar3 + -2);
  lVar39 = (long)(int)uVar10;
  piVar18 = (int *)(*local_1b0 * lVar36 + local_1e8 + 4 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  if (*(char *)(lVar39 + 1 + *(long *)local_260._80_8_ * lVar36 + local_260._24_8_) == '\0') {
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
    uVar17 = *(undefined4 *)
              (*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 + lVar39 * 4);
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
    *(undefined4 *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) = uVar17;
    goto LAB_0017a54f;
  }
  piVar18 = (int *)(*local_1b0 * lVar36 + local_1e8 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  lVar16 = (long)(iVar3 + -3);
  if (*(char *)(lVar39 + lVar36 * *(long *)local_260._80_8_ + local_260._24_8_) != '\0')
  goto LAB_0017992e;
  piVar18 = (int *)(*local_1b0 * lVar16 + local_1e8 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  cVar1 = *(char *)(lVar39 + *(long *)local_260._80_8_ * lVar16 + local_260._24_8_);
  piVar18 = (int *)(*local_288 * lVar16 + local_2c0 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  uVar10 = *(uint *)(lVar16 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4);
  if (cVar1 == '\0') {
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
    uVar12 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 + lVar39 * 4);
    goto LAB_0017acb5;
  }
  piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + lVar39 * 4);
  *piVar18 = *piVar18 + 1;
  *(uint *)(lVar33 * *(long *)local_338._80_8_ + local_338._24_8_ + lVar39 * 4) = uVar10;
  goto LAB_0017a54f;
code_r0x00178a05:
  piVar18 = (int *)(*local_288 * lVar39 + lVar32 + lVar30 * 4);
  *piVar18 = *piVar18 + 1;
  uVar17 = *(undefined4 *)(*(long *)local_338._80_8_ * lVar39 + lVar31 + lVar30 * 4);
  piVar18 = (int *)(*local_288 * lVar33 + lVar32 + lVar30 * 4);
  *piVar18 = *piVar18 + 1;
  *(undefined4 *)(*(long *)local_338._80_8_ * lVar33 + lVar31 + lVar30 * 4) = uVar17;
  lVar24 = lVar24 + 0x200000000;
  lVar40 = lVar30 + 4;
  lVar30 = lVar30 + 2;
  lVar29 = lVar29 + 8;
  lVar36 = local_178;
  if (lVar16 <= (long)local_180 + lVar40) {
    uVar10 = iVar11 + (int)lVar30 + 2;
    uVar27 = (ulong)(uint)(iVar11 + (int)lVar30);
    goto LAB_0017967b;
  }
  goto LAB_00178981;
LAB_00178472:
  uVar27 = uVar38 & 0xffffffff;
  iVar11 = (int)uVar38;
  uVar20 = (ulong)iVar11;
  piVar18 = (int *)(*local_1b0 * local_148 + local_1e8 + -4 + uVar20 * 4);
  *piVar18 = *piVar18 + 1;
  lVar36 = (long)(iVar11 + 2);
  if (*(char *)((uVar20 - 1) + *(long *)local_260._80_8_ * local_148 + local_260._24_8_) == '\0') {
    piVar18 = (int *)(*local_288 * local_148 + local_2c0 + lVar36 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * local_148 + local_338._24_8_ + lVar36 * 4);
    uVar20 = (ulong)iVar11;
    piVar18 = (int *)(*local_288 * lVar33 + local_2c0 + -8 + uVar20 * 4);
    *piVar18 = *piVar18 + 1;
    uVar12 = *(uint *)(*(long *)local_338._80_8_ * lVar33 + local_338._24_8_ + -8 + uVar20 * 4);
LAB_00178ed9:
    uVar10 = TTA::MemMerge(uVar10,uVar12);
    plVar25 = local_270;
LAB_00177a06:
    lVar36 = *local_288;
  }
  else {
    piVar18 = (int *)(*local_288 * local_148 + local_2c0 + lVar36 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = *(uint *)(*(long *)local_338._80_8_ * local_148 + local_338._24_8_ + lVar36 * 4);
    lVar36 = *local_288;
  }
  piVar18 = (int *)(lVar36 * lVar33 + local_2c0 + uVar20 * 4);
  goto LAB_00177a19;
code_r0x0016d375:
  lVar39 = (long)(iVar9 + 3);
LAB_0016d7c1:
  pSVar26 = local_188;
  lVar36 = (long)iVar11;
  piVar18 = (int *)(local_1e8 + lVar36 * 4);
  *piVar18 = *piVar18 + 1;
  if ((int)local_198 < iVar11) {
    if (*(char *)(local_260._24_8_ + lVar36) == '\0') {
      piVar18 = (int *)(local_2c0 + lVar36 * 4);
      *piVar18 = *piVar18 + 1;
      *(undefined4 *)(local_338._24_8_ + lVar36 * 4) = 0;
    }
    else {
      uVar10 = TTA::MemNewLabel();
      piVar18 = (int *)(local_2c0 + lVar36 * 4);
      *piVar18 = *piVar18 + 1;
      *(uint *)(local_338._24_8_ + lVar36 * 4) = uVar10;
    }
  }
  else if (*(char *)(local_260._24_8_ + lVar36) == '\0') {
LAB_0016da1e:
    pSVar26 = local_188;
    lVar39 = (long)iVar11;
    piVar18 = (int *)(local_1e8 + 4 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
    if (*(char *)(local_260._24_8_ + 1 + lVar39) == '\0') {
      piVar18 = (int *)(local_2c0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      *(undefined4 *)(local_338._24_8_ + lVar39 * 4) = 0;
    }
    else {
      uVar10 = TTA::MemNewLabel();
      piVar18 = (int *)(local_2c0 + lVar39 * 4);
      *piVar18 = *piVar18 + 1;
      *(uint *)(local_338._24_8_ + lVar39 * 4) = uVar10;
    }
  }
  else {
    piVar18 = (int *)(local_1e8 + lVar39 * 4);
    *piVar18 = *piVar18 + 1;
    uVar10 = TTA::MemNewLabel();
    piVar18 = (int *)(local_2c0 + lVar36 * 4);
    *piVar18 = *piVar18 + 1;
    *(uint *)(local_338._24_8_ + lVar36 * 4) = uVar10;
  }
LAB_0017a54f:
  uVar10 = TTA::MemFlatten();
  (pSVar26->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  if (0 < iVar3) {
    local_190 = local_2c0;
    local_180 = local_288;
    local_160 = local_338._24_8_;
    local_268 = (long *)local_338._80_8_;
    local_178 = 1;
    uVar27 = 0;
    do {
      piVar7 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        uVar20 = uVar27 | 1;
        local_198 = TTA::mem_rtable_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_270 = (long *)local_260._80_8_;
        lVar36 = *local_288 * local_178 + local_2c0;
        lVar16 = *(long *)local_338._80_8_ * local_178 + local_338._24_8_;
        lVar35 = *(long *)local_338._80_8_ * uVar27 + local_338._24_8_;
        lVar33 = *local_288 * uVar27 + local_2c0;
        lVar39 = 1;
        do {
          iVar3 = *(int *)(lVar33 + -4 + lVar39 * 4);
          *(int *)(lVar33 + -4 + lVar39 * 4) = iVar3 + 1;
          lVar31 = (long)*(int *)(lVar35 + -4 + lVar39 * 4);
          if (lVar31 < 1) {
            *(int *)(lVar33 + -4 + lVar39 * 4) = iVar3 + 2;
            *(undefined4 *)(lVar35 + -4 + lVar39 * 4) = 0;
            if (lVar39 < lVar28) {
              piVar18 = (int *)(lVar33 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(lVar35 + lVar39 * 4) = 0;
              if (uVar20 < uVar22) {
                piVar18 = (int *)(lVar36 + -4 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)(lVar16 + -4 + lVar39 * 4) = 0;
                piVar18 = (int *)(lVar36 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(undefined4 *)(lVar16 + lVar39 * 4) = 0;
              }
            }
            else if (uVar20 < uVar22) {
LAB_0017a7f0:
              piVar18 = (int *)(lVar36 + -4 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(undefined4 *)(lVar16 + -4 + lVar39 * 4) = 0;
            }
          }
          else {
            piVar7[lVar31] = piVar7[lVar31] + 1;
            uVar10 = puVar6[lVar31];
            lVar31 = *local_1b0;
            lVar32 = uVar27 * lVar31 + local_1e8;
            piVar18 = (int *)(lVar32 + -4 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            lVar41 = *(long *)local_260._80_8_;
            lVar24 = uVar27 * lVar41 + local_260._24_8_;
            uVar12 = uVar10;
            if (*(char *)(lVar39 + -1 + lVar24) == '\0') {
              uVar12 = 0;
            }
            piVar18 = (int *)(lVar33 + -4 + lVar39 * 4);
            *piVar18 = *piVar18 + 1;
            *(uint *)(lVar35 + -4 + lVar39 * 4) = uVar12;
            if (lVar39 < lVar28) {
              piVar18 = (int *)(lVar32 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              uVar12 = uVar10;
              if (*(char *)(lVar39 + lVar24) == '\0') {
                uVar12 = 0;
              }
              piVar18 = (int *)(lVar33 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(uint *)(lVar35 + lVar39 * 4) = uVar12;
              if (uVar20 < uVar22) {
                lVar31 = lVar31 * local_178 + local_1e8;
                piVar18 = (int *)(lVar31 + -4 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                lVar41 = lVar41 * local_178 + local_260._24_8_;
                uVar12 = uVar10;
                if (*(char *)(lVar39 + -1 + lVar41) == '\0') {
                  uVar12 = 0;
                }
                piVar18 = (int *)(lVar36 + -4 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                *(uint *)(lVar16 + -4 + lVar39 * 4) = uVar12;
                piVar18 = (int *)(lVar31 + lVar39 * 4);
                *piVar18 = *piVar18 + 1;
                if (*(char *)(lVar39 + lVar41) == '\0') {
                  piVar18 = (int *)(lVar36 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(undefined4 *)(lVar16 + lVar39 * 4) = 0;
                }
                else {
                  piVar18 = (int *)(lVar36 + lVar39 * 4);
                  *piVar18 = *piVar18 + 1;
                  *(uint *)(lVar16 + lVar39 * 4) = uVar10;
                }
              }
            }
            else if (uVar20 < uVar22) {
              piVar18 = (int *)(lVar31 * local_178 + local_1e8 + -4 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              if (*(char *)(lVar39 + -1 + lVar41 * local_178 + local_260._24_8_) == '\0')
              goto LAB_0017a7f0;
              piVar18 = (int *)(lVar36 + -4 + lVar39 * 4);
              *piVar18 = *piVar18 + 1;
              *(uint *)(lVar16 + -4 + lVar39 * 4) = uVar10;
            }
          }
          lVar31 = lVar39 + 1;
          lVar39 = lVar39 + 2;
        } while (lVar31 < lVar28);
      }
      uVar27 = uVar27 + 2;
      local_178 = local_178 + 2;
    } while (uVar27 < uVar22);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar8 = local_118;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_118,local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_1f8;
  cv::sum((_InputArray *)local_108);
  *(pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_2d0;
  cv::sum((_InputArray *)local_108);
  (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_108 >> 0x3f & (long)((double)local_108 - 9.223372036854776e+18) |
       (long)(double)local_108;
  dVar42 = TTA::MemTotalAccesses();
  (pvVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar42 >> 0x3f & (long)(dVar42 - 9.223372036854776e+18) | (long)dVar42;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_338);
  cv::Mat::operator=(&((local_188->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_2d0);
  cv::Mat::~Mat((Mat *)(local_338 + 8));
  cv::Mat::~Mat(local_1f8);
  cv::Mat::~Mat((Mat *)(local_260 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}